

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong uVar34;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar59 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  int iVar87;
  float t1;
  float fVar88;
  undefined4 uVar89;
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vfloat4 b0;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  vfloat4 b0_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  vfloat4 a0_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar198;
  float fVar199;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar200;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar223;
  float fVar224;
  vfloat4 a0;
  undefined1 auVar217 [16];
  float fVar225;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  vfloat4 a0_1;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_33c;
  undefined1 local_338 [16];
  ulong local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  RTCFilterFunctionNArguments local_2c8;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint auStack_168 [4];
  undefined8 local_158;
  float local_150;
  undefined8 local_14c;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  uint uStack_d8;
  float afStack_d4 [7];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar28;
  undefined1 auVar58 [32];
  undefined1 auVar60 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar231 [32];
  
  PVar4 = prim[1];
  uVar34 = (ulong)(byte)PVar4;
  fVar203 = *(float *)(prim + uVar34 * 0x19 + 0x12);
  auVar69._16_16_ =
       vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                  *(undefined1 (*) [16])(prim + uVar34 * 0x19 + 6));
  fVar113 = fVar203 * auVar69._16_4_;
  fVar88 = fVar203 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar34 * 4 + 6);
  auVar56 = vpmovsxbd_avx2(auVar35);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar34 * 5 + 6);
  auVar54 = vpmovsxbd_avx2(auVar48);
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar34 * 6 + 6);
  auVar61 = vpmovsxbd_avx2(auVar47);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar34 * 0xb + 6);
  auVar71 = vpmovsxbd_avx2(auVar46);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar65 = vpmovsxbd_avx2(auVar45);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar72 = vcvtdq2ps_avx(auVar65);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar34 + 6);
  auVar55 = vpmovsxbd_avx2(auVar44);
  auVar55 = vcvtdq2ps_avx(auVar55);
  uVar33 = (ulong)(uint)((int)(uVar34 * 9) * 2);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar33 + 6);
  auVar62 = vpmovsxbd_avx2(auVar43);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar33 + uVar34 + 6);
  auVar63 = vpmovsxbd_avx2(auVar42);
  auVar63 = vcvtdq2ps_avx(auVar63);
  uVar27 = (ulong)(uint)((int)(uVar34 * 5) << 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar27 + 6);
  auVar53 = vpmovsxbd_avx2(auVar38);
  auVar64 = vcvtdq2ps_avx(auVar53);
  auVar229._4_4_ = fVar88;
  auVar229._0_4_ = fVar88;
  auVar229._8_4_ = fVar88;
  auVar229._12_4_ = fVar88;
  auVar229._16_4_ = fVar88;
  auVar229._20_4_ = fVar88;
  auVar229._24_4_ = fVar88;
  auVar229._28_4_ = fVar88;
  auVar237._8_4_ = 1;
  auVar237._0_8_ = 0x100000001;
  auVar237._12_4_ = 1;
  auVar237._16_4_ = 1;
  auVar237._20_4_ = 1;
  auVar237._24_4_ = 1;
  auVar237._28_4_ = 1;
  auVar51 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar67 = ZEXT1632(CONCAT412(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar203 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar88))));
  auVar66 = vpermps_avx2(auVar237,auVar67);
  auVar52 = vpermps_avx512vl(auVar51,auVar67);
  fVar88 = auVar52._0_4_;
  fVar198 = auVar52._4_4_;
  auVar67._4_4_ = fVar198 * auVar61._4_4_;
  auVar67._0_4_ = fVar88 * auVar61._0_4_;
  fVar199 = auVar52._8_4_;
  auVar67._8_4_ = fVar199 * auVar61._8_4_;
  fVar200 = auVar52._12_4_;
  auVar67._12_4_ = fVar200 * auVar61._12_4_;
  fVar201 = auVar52._16_4_;
  auVar67._16_4_ = fVar201 * auVar61._16_4_;
  fVar202 = auVar52._20_4_;
  auVar67._20_4_ = fVar202 * auVar61._20_4_;
  fVar91 = auVar52._24_4_;
  auVar67._24_4_ = fVar91 * auVar61._24_4_;
  auVar67._28_4_ = auVar65._28_4_;
  auVar65._4_4_ = auVar55._4_4_ * fVar198;
  auVar65._0_4_ = auVar55._0_4_ * fVar88;
  auVar65._8_4_ = auVar55._8_4_ * fVar199;
  auVar65._12_4_ = auVar55._12_4_ * fVar200;
  auVar65._16_4_ = auVar55._16_4_ * fVar201;
  auVar65._20_4_ = auVar55._20_4_ * fVar202;
  auVar65._24_4_ = auVar55._24_4_ * fVar91;
  auVar65._28_4_ = auVar53._28_4_;
  auVar53._4_4_ = auVar64._4_4_ * fVar198;
  auVar53._0_4_ = auVar64._0_4_ * fVar88;
  auVar53._8_4_ = auVar64._8_4_ * fVar199;
  auVar53._12_4_ = auVar64._12_4_ * fVar200;
  auVar53._16_4_ = auVar64._16_4_ * fVar201;
  auVar53._20_4_ = auVar64._20_4_ * fVar202;
  auVar53._24_4_ = auVar64._24_4_ * fVar91;
  auVar53._28_4_ = auVar52._28_4_;
  auVar35 = vfmadd231ps_fma(auVar67,auVar66,auVar54);
  auVar48 = vfmadd231ps_fma(auVar65,auVar66,auVar72);
  auVar47 = vfmadd231ps_fma(auVar53,auVar63,auVar66);
  auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar229,auVar56);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar229,auVar71);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar62,auVar229);
  auVar230._4_4_ = fVar113;
  auVar230._0_4_ = fVar113;
  auVar230._8_4_ = fVar113;
  auVar230._12_4_ = fVar113;
  auVar230._16_4_ = fVar113;
  auVar230._20_4_ = fVar113;
  auVar230._24_4_ = fVar113;
  auVar230._28_4_ = fVar113;
  auVar53 = ZEXT1632(CONCAT412(fVar203 * auVar69._28_4_,
                               CONCAT48(fVar203 * auVar69._24_4_,
                                        CONCAT44(fVar203 * auVar69._20_4_,fVar113))));
  auVar65 = vpermps_avx2(auVar237,auVar53);
  auVar53 = vpermps_avx512vl(auVar51,auVar53);
  fVar203 = auVar53._0_4_;
  fVar88 = auVar53._4_4_;
  auVar66._4_4_ = fVar88 * auVar61._4_4_;
  auVar66._0_4_ = fVar203 * auVar61._0_4_;
  fVar198 = auVar53._8_4_;
  auVar66._8_4_ = fVar198 * auVar61._8_4_;
  fVar199 = auVar53._12_4_;
  auVar66._12_4_ = fVar199 * auVar61._12_4_;
  fVar200 = auVar53._16_4_;
  auVar66._16_4_ = fVar200 * auVar61._16_4_;
  fVar201 = auVar53._20_4_;
  auVar66._20_4_ = fVar201 * auVar61._20_4_;
  fVar202 = auVar53._24_4_;
  auVar66._24_4_ = fVar202 * auVar61._24_4_;
  auVar66._28_4_ = 1;
  auVar51._4_4_ = auVar55._4_4_ * fVar88;
  auVar51._0_4_ = auVar55._0_4_ * fVar203;
  auVar51._8_4_ = auVar55._8_4_ * fVar198;
  auVar51._12_4_ = auVar55._12_4_ * fVar199;
  auVar51._16_4_ = auVar55._16_4_ * fVar200;
  auVar51._20_4_ = auVar55._20_4_ * fVar201;
  auVar51._24_4_ = auVar55._24_4_ * fVar202;
  auVar51._28_4_ = auVar61._28_4_;
  auVar55._4_4_ = auVar64._4_4_ * fVar88;
  auVar55._0_4_ = auVar64._0_4_ * fVar203;
  auVar55._8_4_ = auVar64._8_4_ * fVar198;
  auVar55._12_4_ = auVar64._12_4_ * fVar199;
  auVar55._16_4_ = auVar64._16_4_ * fVar200;
  auVar55._20_4_ = auVar64._20_4_ * fVar201;
  auVar55._24_4_ = auVar64._24_4_ * fVar202;
  auVar55._28_4_ = auVar53._28_4_;
  auVar46 = vfmadd231ps_fma(auVar66,auVar65,auVar54);
  auVar45 = vfmadd231ps_fma(auVar51,auVar65,auVar72);
  auVar44 = vfmadd231ps_fma(auVar55,auVar65,auVar63);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar230,auVar56);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar230,auVar71);
  auVar75._8_4_ = 0x7fffffff;
  auVar75._0_8_ = 0x7fffffff7fffffff;
  auVar75._12_4_ = 0x7fffffff;
  auVar75._16_4_ = 0x7fffffff;
  auVar75._20_4_ = 0x7fffffff;
  auVar75._24_4_ = 0x7fffffff;
  auVar75._28_4_ = 0x7fffffff;
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar230,auVar62);
  auVar56 = vandps_avx(ZEXT1632(auVar35),auVar75);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar133._16_4_ = 0x219392ef;
  auVar133._20_4_ = 0x219392ef;
  auVar133._24_4_ = 0x219392ef;
  auVar133._28_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar56,auVar133,1);
  bVar10 = (bool)((byte)uVar33 & 1);
  auVar52._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar35._0_4_;
  bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar35._4_4_;
  bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar35._8_4_;
  bVar10 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar52._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar35._12_4_;
  auVar52._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar52._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar52._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar52._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar56 = vandps_avx(ZEXT1632(auVar48),auVar75);
  uVar33 = vcmpps_avx512vl(auVar56,auVar133,1);
  bVar10 = (bool)((byte)uVar33 & 1);
  auVar68._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar48._0_4_;
  bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar48._4_4_;
  bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar48._8_4_;
  bVar10 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar48._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar56 = vandps_avx(ZEXT1632(auVar47),auVar75);
  uVar33 = vcmpps_avx512vl(auVar56,auVar133,1);
  bVar10 = (bool)((byte)uVar33 & 1);
  auVar56._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar47._0_4_;
  bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar47._4_4_;
  bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar47._8_4_;
  bVar10 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar47._12_4_;
  auVar56._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar56._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar56._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar56._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar54 = vrcp14ps_avx512vl(auVar52);
  auVar120._8_4_ = 0x3f800000;
  auVar120._0_8_ = &DAT_3f8000003f800000;
  auVar120._12_4_ = 0x3f800000;
  auVar120._16_4_ = 0x3f800000;
  auVar120._20_4_ = 0x3f800000;
  auVar120._24_4_ = 0x3f800000;
  auVar120._28_4_ = 0x3f800000;
  auVar35 = vfnmadd213ps_fma(auVar52,auVar54,auVar120);
  auVar35 = vfmadd132ps_fma(ZEXT1632(auVar35),auVar54,auVar54);
  auVar54 = vrcp14ps_avx512vl(auVar68);
  auVar48 = vfnmadd213ps_fma(auVar68,auVar54,auVar120);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar54,auVar54);
  auVar54 = vrcp14ps_avx512vl(auVar56);
  auVar47 = vfnmadd213ps_fma(auVar56,auVar54,auVar120);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar54,auVar54);
  auVar56 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar34 * 7 + 6));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,ZEXT1632(auVar46));
  auVar62._4_4_ = auVar35._4_4_ * auVar56._4_4_;
  auVar62._0_4_ = auVar35._0_4_ * auVar56._0_4_;
  auVar62._8_4_ = auVar35._8_4_ * auVar56._8_4_;
  auVar62._12_4_ = auVar35._12_4_ * auVar56._12_4_;
  auVar62._16_4_ = auVar56._16_4_ * 0.0;
  auVar62._20_4_ = auVar56._20_4_ * 0.0;
  auVar62._24_4_ = auVar56._24_4_ * 0.0;
  auVar62._28_4_ = auVar56._28_4_;
  auVar56 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar34 * 9 + 6));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,ZEXT1632(auVar46));
  auVar55 = vpbroadcastd_avx512vl();
  auVar54 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar74._0_4_ = auVar35._0_4_ * auVar56._0_4_;
  auVar74._4_4_ = auVar35._4_4_ * auVar56._4_4_;
  auVar74._8_4_ = auVar35._8_4_ * auVar56._8_4_;
  auVar74._12_4_ = auVar35._12_4_ * auVar56._12_4_;
  auVar74._16_4_ = auVar56._16_4_ * 0.0;
  auVar74._20_4_ = auVar56._20_4_ * 0.0;
  auVar74._24_4_ = auVar56._24_4_ * 0.0;
  auVar74._28_4_ = 0;
  auVar56 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar34 * -2 + 6));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,ZEXT1632(auVar45));
  auVar63._4_4_ = auVar48._4_4_ * auVar56._4_4_;
  auVar63._0_4_ = auVar48._0_4_ * auVar56._0_4_;
  auVar63._8_4_ = auVar48._8_4_ * auVar56._8_4_;
  auVar63._12_4_ = auVar48._12_4_ * auVar56._12_4_;
  auVar63._16_4_ = auVar56._16_4_ * 0.0;
  auVar63._20_4_ = auVar56._20_4_ * 0.0;
  auVar63._24_4_ = auVar56._24_4_ * 0.0;
  auVar63._28_4_ = auVar56._28_4_;
  auVar56 = vcvtdq2ps_avx(auVar54);
  auVar56 = vsubps_avx(auVar56,ZEXT1632(auVar45));
  auVar73._0_4_ = auVar48._0_4_ * auVar56._0_4_;
  auVar73._4_4_ = auVar48._4_4_ * auVar56._4_4_;
  auVar73._8_4_ = auVar48._8_4_ * auVar56._8_4_;
  auVar73._12_4_ = auVar48._12_4_ * auVar56._12_4_;
  auVar73._16_4_ = auVar56._16_4_ * 0.0;
  auVar73._20_4_ = auVar56._20_4_ * 0.0;
  auVar73._24_4_ = auVar56._24_4_ * 0.0;
  auVar73._28_4_ = 0;
  auVar56 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 + uVar34 + 6));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,ZEXT1632(auVar44));
  auVar64._4_4_ = auVar56._4_4_ * auVar47._4_4_;
  auVar64._0_4_ = auVar56._0_4_ * auVar47._0_4_;
  auVar64._8_4_ = auVar56._8_4_ * auVar47._8_4_;
  auVar64._12_4_ = auVar56._12_4_ * auVar47._12_4_;
  auVar64._16_4_ = auVar56._16_4_ * 0.0;
  auVar64._20_4_ = auVar56._20_4_ * 0.0;
  auVar64._24_4_ = auVar56._24_4_ * 0.0;
  auVar64._28_4_ = auVar56._28_4_;
  auVar56 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar34 * 0x17 + 6));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar56 = vsubps_avx(auVar56,ZEXT1632(auVar44));
  auVar70._0_4_ = auVar47._0_4_ * auVar56._0_4_;
  auVar70._4_4_ = auVar47._4_4_ * auVar56._4_4_;
  auVar70._8_4_ = auVar47._8_4_ * auVar56._8_4_;
  auVar70._12_4_ = auVar47._12_4_ * auVar56._12_4_;
  auVar70._16_4_ = auVar56._16_4_ * 0.0;
  auVar70._20_4_ = auVar56._20_4_ * 0.0;
  auVar70._24_4_ = auVar56._24_4_ * 0.0;
  auVar70._28_4_ = 0;
  auVar56 = vpminsd_avx2(auVar62,auVar74);
  auVar54 = vpminsd_avx2(auVar63,auVar73);
  auVar56 = vmaxps_avx(auVar56,auVar54);
  auVar54 = vpminsd_avx2(auVar64,auVar70);
  uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar61._4_4_ = uVar89;
  auVar61._0_4_ = uVar89;
  auVar61._8_4_ = uVar89;
  auVar61._12_4_ = uVar89;
  auVar61._16_4_ = uVar89;
  auVar61._20_4_ = uVar89;
  auVar61._24_4_ = uVar89;
  auVar61._28_4_ = uVar89;
  auVar54 = vmaxps_avx512vl(auVar54,auVar61);
  auVar56 = vmaxps_avx(auVar56,auVar54);
  auVar54._8_4_ = 0x3f7ffffa;
  auVar54._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar54._12_4_ = 0x3f7ffffa;
  auVar54._16_4_ = 0x3f7ffffa;
  auVar54._20_4_ = 0x3f7ffffa;
  auVar54._24_4_ = 0x3f7ffffa;
  auVar54._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar56,auVar54);
  auVar56 = vpmaxsd_avx2(auVar62,auVar74);
  auVar54 = vpmaxsd_avx2(auVar63,auVar73);
  auVar56 = vminps_avx(auVar56,auVar54);
  auVar54 = vpmaxsd_avx2(auVar64,auVar70);
  fVar203 = (ray->super_RayK<1>).tfar;
  auVar71._4_4_ = fVar203;
  auVar71._0_4_ = fVar203;
  auVar71._8_4_ = fVar203;
  auVar71._12_4_ = fVar203;
  auVar71._16_4_ = fVar203;
  auVar71._20_4_ = fVar203;
  auVar71._24_4_ = fVar203;
  auVar71._28_4_ = fVar203;
  auVar54 = vminps_avx512vl(auVar54,auVar71);
  auVar56 = vminps_avx(auVar56,auVar54);
  auVar72._8_4_ = 0x3f800003;
  auVar72._0_8_ = 0x3f8000033f800003;
  auVar72._12_4_ = 0x3f800003;
  auVar72._16_4_ = 0x3f800003;
  auVar72._20_4_ = 0x3f800003;
  auVar72._24_4_ = 0x3f800003;
  auVar72._28_4_ = 0x3f800003;
  auVar56 = vmulps_avx512vl(auVar56,auVar72);
  uVar13 = vpcmpgtd_avx512vl(auVar55,_DAT_0205a920);
  uVar12 = vcmpps_avx512vl(local_b8,auVar56,2);
  if ((byte)((byte)uVar12 & (byte)uVar13) == 0) {
    return;
  }
  uVar33 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
  auVar69._16_16_ = auVar56._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar247 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar248 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar35);
LAB_01dcc210:
  lVar31 = 0;
  for (uVar27 = uVar33; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar32 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar32].ptr;
  local_320 = (ulong)*(uint *)(prim + lVar31 * 4 + 6);
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar31 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar35 = *(undefined1 (*) [16])(_Var9 + uVar27 * (long)pvVar8);
  auVar48 = *(undefined1 (*) [16])(_Var9 + (uVar27 + 1) * (long)pvVar8);
  auVar47 = *(undefined1 (*) [16])(_Var9 + (uVar27 + 2) * (long)pvVar8);
  auVar46 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar27 + 3));
  lVar31 = *(long *)&pGVar6[1].time_range.upper;
  auVar45 = *(undefined1 (*) [16])(lVar31 + (long)p_Var7 * uVar27);
  auVar44 = *(undefined1 (*) [16])(lVar31 + (long)p_Var7 * (uVar27 + 1));
  auVar43 = *(undefined1 (*) [16])(lVar31 + (long)p_Var7 * (uVar27 + 2));
  uVar33 = uVar33 - 1 & uVar33;
  auVar42 = *(undefined1 (*) [16])(lVar31 + (long)p_Var7 * (uVar27 + 3));
  if (uVar33 != 0) {
    uVar34 = uVar33 - 1 & uVar33;
    for (uVar27 = uVar33; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    }
    if (uVar34 != 0) {
      for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar93 = auVar247._0_16_;
  auVar36 = vmulps_avx512vl(auVar42,auVar93);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar36);
  auVar37._0_4_ = auVar44._0_4_ + auVar38._0_4_;
  auVar37._4_4_ = auVar44._4_4_ + auVar38._4_4_;
  auVar37._8_4_ = auVar44._8_4_ + auVar38._8_4_;
  auVar37._12_4_ = auVar44._12_4_ + auVar38._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar45,auVar93);
  auVar58._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar38 = vmulps_avx512vl(auVar42,auVar58._0_16_);
  auVar49 = auVar248._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar43,auVar49);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar44,auVar58._0_16_);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar45,auVar49);
  auVar40 = vmulps_avx512vl(auVar46,auVar93);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar40);
  auVar217._0_4_ = auVar38._0_4_ + auVar48._0_4_;
  auVar217._4_4_ = auVar38._4_4_ + auVar48._4_4_;
  auVar217._8_4_ = auVar38._8_4_ + auVar48._8_4_;
  auVar217._12_4_ = auVar38._12_4_ + auVar48._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar217,auVar35,auVar93);
  auVar41 = vmulps_avx512vl(auVar46,auVar58._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar47,auVar49);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar58._0_16_);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar35,auVar49);
  auVar101._0_4_ = auVar43._0_4_ + auVar36._0_4_;
  auVar101._4_4_ = auVar43._4_4_ + auVar36._4_4_;
  auVar101._8_4_ = auVar43._8_4_ + auVar36._8_4_;
  auVar101._12_4_ = auVar43._12_4_ + auVar36._12_4_;
  auVar36 = vfmadd231ps_avx512vl(auVar101,auVar44,auVar58._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar45,auVar93);
  auVar42 = vmulps_avx512vl(auVar42,auVar49);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar58._0_16_,auVar43);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar49,auVar44);
  auVar43 = vfmadd231ps_avx512vl(auVar44,auVar58._0_16_,auVar45);
  auVar167._0_4_ = auVar40._0_4_ + auVar47._0_4_;
  auVar167._4_4_ = auVar40._4_4_ + auVar47._4_4_;
  auVar167._8_4_ = auVar40._8_4_ + auVar47._8_4_;
  auVar167._12_4_ = auVar40._12_4_ + auVar47._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar167,auVar48,auVar58._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar35,auVar93);
  auVar46 = vmulps_avx512vl(auVar46,auVar49);
  auVar47 = vfmadd231ps_avx512vl(auVar46,auVar58._0_16_,auVar47);
  auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar49,auVar48);
  auVar44 = vfmadd231ps_avx512vl(auVar48,auVar58._0_16_,auVar35);
  auVar35 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar48 = vshufps_avx(auVar38,auVar38,0xc9);
  fVar200 = auVar39._0_4_;
  auVar135._0_4_ = fVar200 * auVar48._0_4_;
  fVar201 = auVar39._4_4_;
  auVar135._4_4_ = fVar201 * auVar48._4_4_;
  fVar202 = auVar39._8_4_;
  auVar135._8_4_ = fVar202 * auVar48._8_4_;
  fVar91 = auVar39._12_4_;
  auVar135._12_4_ = fVar91 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar135,auVar35,auVar38);
  auVar47 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar136._0_4_ = fVar200 * auVar48._0_4_;
  auVar136._4_4_ = fVar201 * auVar48._4_4_;
  auVar136._8_4_ = fVar202 * auVar48._8_4_;
  auVar136._12_4_ = fVar91 * auVar48._12_4_;
  auVar35 = vfmsub231ps_fma(auVar136,auVar35,auVar41);
  auVar46 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar48 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar113 = auVar43._0_4_;
  auVar126._0_4_ = fVar113 * auVar48._0_4_;
  fVar123 = auVar43._4_4_;
  auVar126._4_4_ = fVar123 * auVar48._4_4_;
  fVar124 = auVar43._8_4_;
  auVar126._8_4_ = fVar124 * auVar48._8_4_;
  fVar125 = auVar43._12_4_;
  auVar126._12_4_ = fVar125 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar126,auVar35,auVar45);
  auVar45 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar168._0_4_ = auVar48._0_4_ * fVar113;
  auVar168._4_4_ = auVar48._4_4_ * fVar123;
  auVar168._8_4_ = auVar48._8_4_ * fVar124;
  auVar168._12_4_ = auVar48._12_4_ * fVar125;
  auVar48 = vfmsub231ps_fma(auVar168,auVar35,auVar44);
  auVar35 = vdpps_avx(auVar47,auVar47,0x7f);
  auVar44 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar88 = auVar35._0_4_;
  auVar58._16_16_ = auVar69._16_16_;
  auVar57._4_28_ = auVar58._4_28_;
  auVar57._0_4_ = fVar88;
  auVar48 = vrsqrt14ss_avx512f(auVar58._0_16_,auVar57._0_16_);
  fVar203 = auVar48._0_4_;
  auVar48 = vdpps_avx(auVar47,auVar46,0x7f);
  fVar203 = fVar203 * 1.5 + fVar88 * -0.5 * fVar203 * fVar203 * fVar203;
  fVar204 = fVar203 * auVar47._0_4_;
  fVar213 = fVar203 * auVar47._4_4_;
  fVar214 = fVar203 * auVar47._8_4_;
  fVar215 = fVar203 * auVar47._12_4_;
  auVar179._0_4_ = auVar46._0_4_ * fVar88;
  auVar179._4_4_ = auVar46._4_4_ * fVar88;
  auVar179._8_4_ = auVar46._8_4_ * fVar88;
  auVar179._12_4_ = auVar46._12_4_ * fVar88;
  fVar88 = auVar48._0_4_;
  auVar146._0_4_ = fVar88 * auVar47._0_4_;
  auVar146._4_4_ = fVar88 * auVar47._4_4_;
  auVar146._8_4_ = fVar88 * auVar47._8_4_;
  auVar146._12_4_ = fVar88 * auVar47._12_4_;
  auVar47 = vsubps_avx(auVar179,auVar146);
  auVar48 = vrcp14ss_avx512f(auVar58._0_16_,auVar57._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar48,ZEXT416(0x40000000));
  fVar198 = auVar48._0_4_ * auVar35._0_4_;
  auVar35 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar199 = auVar35._0_4_;
  auVar60._16_16_ = auVar69._16_16_;
  auVar60._0_16_ = auVar58._0_16_;
  auVar59._4_28_ = auVar60._4_28_;
  auVar59._0_4_ = fVar199;
  auVar48 = vrsqrt14ss_avx512f(auVar58._0_16_,auVar59._0_16_);
  fVar88 = auVar48._0_4_;
  fVar88 = fVar88 * 1.5 + fVar199 * -0.5 * fVar88 * fVar88 * fVar88;
  auVar48 = vdpps_avx(auVar45,auVar44,0x7f);
  fVar216 = fVar88 * auVar45._0_4_;
  fVar223 = fVar88 * auVar45._4_4_;
  fVar224 = fVar88 * auVar45._8_4_;
  fVar225 = fVar88 * auVar45._12_4_;
  auVar137._0_4_ = fVar199 * auVar44._0_4_;
  auVar137._4_4_ = fVar199 * auVar44._4_4_;
  auVar137._8_4_ = fVar199 * auVar44._8_4_;
  auVar137._12_4_ = fVar199 * auVar44._12_4_;
  fVar199 = auVar48._0_4_;
  auVar127._0_4_ = fVar199 * auVar45._0_4_;
  auVar127._4_4_ = fVar199 * auVar45._4_4_;
  auVar127._8_4_ = fVar199 * auVar45._8_4_;
  auVar127._12_4_ = fVar199 * auVar45._12_4_;
  auVar46 = vsubps_avx(auVar137,auVar127);
  auVar48 = vrcp14ss_avx512f(auVar58._0_16_,auVar59._0_16_);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar48,ZEXT416(0x40000000));
  fVar199 = auVar48._0_4_ * auVar35._0_4_;
  auVar35 = vshufps_avx(auVar37,auVar37,0xff);
  auVar152._0_4_ = fVar204 * auVar35._0_4_;
  auVar152._4_4_ = fVar213 * auVar35._4_4_;
  auVar152._8_4_ = fVar214 * auVar35._8_4_;
  auVar152._12_4_ = fVar215 * auVar35._12_4_;
  local_218 = vsubps_avx(auVar37,auVar152);
  auVar48 = vshufps_avx(auVar39,auVar39,0xff);
  auVar138._0_4_ = auVar48._0_4_ * fVar204 + auVar35._0_4_ * fVar203 * auVar47._0_4_ * fVar198;
  auVar138._4_4_ = auVar48._4_4_ * fVar213 + auVar35._4_4_ * fVar203 * auVar47._4_4_ * fVar198;
  auVar138._8_4_ = auVar48._8_4_ * fVar214 + auVar35._8_4_ * fVar203 * auVar47._8_4_ * fVar198;
  auVar138._12_4_ = auVar48._12_4_ * fVar215 + auVar35._12_4_ * fVar203 * auVar47._12_4_ * fVar198;
  auVar47 = vsubps_avx(auVar39,auVar138);
  local_228._0_4_ = auVar37._0_4_ + auVar152._0_4_;
  local_228._4_4_ = auVar37._4_4_ + auVar152._4_4_;
  fStack_220 = auVar37._8_4_ + auVar152._8_4_;
  fStack_21c = auVar37._12_4_ + auVar152._12_4_;
  auVar35 = vshufps_avx(auVar36,auVar36,0xff);
  auVar139._0_4_ = fVar216 * auVar35._0_4_;
  auVar139._4_4_ = fVar223 * auVar35._4_4_;
  auVar139._8_4_ = fVar224 * auVar35._8_4_;
  auVar139._12_4_ = fVar225 * auVar35._12_4_;
  local_238 = vsubps_avx(auVar36,auVar139);
  auVar48 = vshufps_avx(auVar43,auVar43,0xff);
  auVar41._0_4_ = fVar216 * auVar48._0_4_ + auVar35._0_4_ * fVar88 * auVar46._0_4_ * fVar199;
  auVar41._4_4_ = fVar223 * auVar48._4_4_ + auVar35._4_4_ * fVar88 * auVar46._4_4_ * fVar199;
  auVar41._8_4_ = fVar224 * auVar48._8_4_ + auVar35._8_4_ * fVar88 * auVar46._8_4_ * fVar199;
  auVar41._12_4_ = fVar225 * auVar48._12_4_ + auVar35._12_4_ * fVar88 * auVar46._12_4_ * fVar199;
  auVar35 = vsubps_avx(auVar43,auVar41);
  _local_248 = vaddps_avx512vl(auVar36,auVar139);
  auVar102._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar102._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar102._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar102._12_4_ = auVar47._12_4_ * 0.33333334;
  local_258 = vaddps_avx512vl(local_218,auVar102);
  auVar50._0_4_ = auVar35._0_4_ * 0.33333334;
  auVar50._4_4_ = auVar35._4_4_ * 0.33333334;
  auVar50._8_4_ = auVar35._8_4_ * 0.33333334;
  auVar50._12_4_ = auVar35._12_4_ * 0.33333334;
  local_268 = vsubps_avx512vl(local_238,auVar50);
  auVar36._0_4_ = (fVar200 + auVar138._0_4_) * 0.33333334;
  auVar36._4_4_ = (fVar201 + auVar138._4_4_) * 0.33333334;
  auVar36._8_4_ = (fVar202 + auVar138._8_4_) * 0.33333334;
  auVar36._12_4_ = (fVar91 + auVar138._12_4_) * 0.33333334;
  _local_278 = vaddps_avx512vl(_local_228,auVar36);
  auVar39._0_4_ = (fVar113 + auVar41._0_4_) * 0.33333334;
  auVar39._4_4_ = (fVar123 + auVar41._4_4_) * 0.33333334;
  auVar39._8_4_ = (fVar124 + auVar41._8_4_) * 0.33333334;
  auVar39._12_4_ = (fVar125 + auVar41._12_4_) * 0.33333334;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  _local_288 = vsubps_avx512vl(_local_248,auVar39);
  auVar48 = vsubps_avx(local_218,(undefined1  [16])aVar1);
  uVar89 = auVar48._0_4_;
  auVar49._4_4_ = uVar89;
  auVar49._0_4_ = uVar89;
  auVar49._8_4_ = uVar89;
  auVar49._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar48,auVar48,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar203 = (pre->ray_space).vz.field_0.m128[0];
  fVar88 = (pre->ray_space).vz.field_0.m128[1];
  fVar198 = (pre->ray_space).vz.field_0.m128[2];
  fVar199 = (pre->ray_space).vz.field_0.m128[3];
  auVar40._0_4_ = fVar203 * auVar48._0_4_;
  auVar40._4_4_ = fVar88 * auVar48._4_4_;
  auVar40._8_4_ = fVar198 * auVar48._8_4_;
  auVar40._12_4_ = fVar199 * auVar48._12_4_;
  auVar35 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar35);
  auVar45 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar49);
  auVar48 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar89 = auVar48._0_4_;
  auVar103._4_4_ = uVar89;
  auVar103._0_4_ = uVar89;
  auVar103._8_4_ = uVar89;
  auVar103._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar92._0_4_ = fVar203 * auVar48._0_4_;
  auVar92._4_4_ = fVar88 * auVar48._4_4_;
  auVar92._8_4_ = fVar198 * auVar48._8_4_;
  auVar92._12_4_ = fVar199 * auVar48._12_4_;
  auVar35 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar3,auVar35);
  auVar44 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar103);
  auVar48 = vsubps_avx512vl(local_268,(undefined1  [16])aVar1);
  uVar89 = auVar48._0_4_;
  auVar153._4_4_ = uVar89;
  auVar153._0_4_ = uVar89;
  auVar153._8_4_ = uVar89;
  auVar153._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar104._0_4_ = fVar203 * auVar48._0_4_;
  auVar104._4_4_ = fVar88 * auVar48._4_4_;
  auVar104._8_4_ = fVar198 * auVar48._8_4_;
  auVar104._12_4_ = fVar199 * auVar48._12_4_;
  auVar35 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar3,auVar35);
  auVar43 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar153);
  auVar48 = vsubps_avx(local_238,(undefined1  [16])aVar1);
  uVar89 = auVar48._0_4_;
  auVar169._4_4_ = uVar89;
  auVar169._0_4_ = uVar89;
  auVar169._8_4_ = uVar89;
  auVar169._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar154._0_4_ = fVar203 * auVar48._0_4_;
  auVar154._4_4_ = fVar88 * auVar48._4_4_;
  auVar154._8_4_ = fVar198 * auVar48._8_4_;
  auVar154._12_4_ = fVar199 * auVar48._12_4_;
  auVar35 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar3,auVar35);
  auVar42 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar169);
  auVar48 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
  uVar89 = auVar48._0_4_;
  auVar180._4_4_ = uVar89;
  auVar180._0_4_ = uVar89;
  auVar180._8_4_ = uVar89;
  auVar180._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar170._0_4_ = auVar48._0_4_ * fVar203;
  auVar170._4_4_ = auVar48._4_4_ * fVar88;
  auVar170._8_4_ = auVar48._8_4_ * fVar198;
  auVar170._12_4_ = auVar48._12_4_ * fVar199;
  auVar35 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar3,auVar35);
  auVar38 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar180);
  auVar48 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar89 = auVar48._0_4_;
  auVar188._4_4_ = uVar89;
  auVar188._0_4_ = uVar89;
  auVar188._8_4_ = uVar89;
  auVar188._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar181._0_4_ = auVar48._0_4_ * fVar203;
  auVar181._4_4_ = auVar48._4_4_ * fVar88;
  auVar181._8_4_ = auVar48._8_4_ * fVar198;
  auVar181._12_4_ = auVar48._12_4_ * fVar199;
  auVar35 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar35);
  auVar69._16_16_ = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar188);
  auVar48 = vsubps_avx512vl(_local_288,(undefined1  [16])aVar1);
  uVar89 = auVar48._0_4_;
  auVar205._4_4_ = uVar89;
  auVar205._0_4_ = uVar89;
  auVar205._8_4_ = uVar89;
  auVar205._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar189._0_4_ = auVar48._0_4_ * fVar203;
  auVar189._4_4_ = auVar48._4_4_ * fVar88;
  auVar189._8_4_ = auVar48._8_4_ * fVar198;
  auVar189._12_4_ = auVar48._12_4_ * fVar199;
  auVar35 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar3,auVar35);
  auVar36 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar205);
  auVar48 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar1);
  uVar89 = auVar48._0_4_;
  auVar206._4_4_ = uVar89;
  auVar206._0_4_ = uVar89;
  auVar206._8_4_ = uVar89;
  auVar206._12_4_ = uVar89;
  auVar35 = vshufps_avx(auVar48,auVar48,0x55);
  auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar128._0_4_ = fVar203 * auVar48._0_4_;
  auVar128._4_4_ = fVar88 * auVar48._4_4_;
  auVar128._8_4_ = fVar198 * auVar48._8_4_;
  auVar128._12_4_ = fVar199 * auVar48._12_4_;
  auVar35 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar3,auVar35);
  auVar37 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar206);
  local_338 = vmovlhps_avx512f(auVar45,auVar38);
  auVar246 = ZEXT1664(local_338);
  local_2d8 = vmovlhps_avx(auVar44,auVar69._16_16_);
  local_2e8 = vmovlhps_avx512f(auVar43,auVar36);
  _local_1f8 = vmovlhps_avx512f(auVar42,auVar37);
  auVar35 = vminps_avx512vl(local_338,local_2d8);
  auVar47 = vmaxps_avx512vl(local_338,local_2d8);
  auVar48 = vminps_avx512vl(local_2e8,_local_1f8);
  auVar48 = vminps_avx(auVar35,auVar48);
  auVar35 = vmaxps_avx512vl(local_2e8,_local_1f8);
  auVar35 = vmaxps_avx(auVar47,auVar35);
  auVar47 = vshufpd_avx(auVar48,auVar48,3);
  auVar46 = vshufpd_avx(auVar35,auVar35,3);
  auVar48 = vminps_avx(auVar48,auVar47);
  auVar35 = vmaxps_avx(auVar35,auVar46);
  auVar48 = vandps_avx512vl(auVar48,auVar240._0_16_);
  auVar35 = vandps_avx512vl(auVar35,auVar240._0_16_);
  auVar35 = vmaxps_avx(auVar48,auVar35);
  auVar48 = vmovshdup_avx(auVar35);
  auVar35 = vmaxss_avx(auVar48,auVar35);
  local_178._8_8_ = auVar45._0_8_;
  local_178._0_8_ = auVar45._0_8_;
  local_188._8_8_ = auVar44._0_8_;
  local_188._0_8_ = auVar44._0_8_;
  local_198 = vmovddup_avx512vl(auVar43);
  local_1a8._0_8_ = auVar42._0_8_;
  local_1a8._8_8_ = local_1a8._0_8_;
  register0x00001348 = auVar38._0_8_;
  local_1b8 = auVar38._0_8_;
  register0x00001408 = auVar69._16_8_;
  local_1c8 = auVar69._16_8_;
  register0x00001448 = auVar36._0_8_;
  local_1d8 = auVar36._0_8_;
  register0x00001488 = auVar37._0_8_;
  local_1e8 = auVar37._0_8_;
  local_208 = ZEXT416((uint)(auVar35._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_208);
  auVar35 = vxorps_avx512vl(local_78._0_16_,auVar93);
  local_98 = vbroadcastss_avx512vl(auVar35);
  local_308 = vsubps_avx512vl(local_2d8,local_338);
  local_318 = vsubps_avx512vl(local_2e8,local_2d8);
  local_e8 = vsubps_avx512vl(_local_1f8,local_2e8);
  local_f8 = vsubps_avx(_local_228,local_218);
  local_108 = vsubps_avx512vl(_local_278,local_258);
  local_118 = vsubps_avx512vl(_local_288,local_268);
  _local_128 = vsubps_avx512vl(_local_248,local_238);
  uVar27 = 0;
  auVar35 = ZEXT816(0x3f80000000000000);
  auVar238 = ZEXT1664(auVar35);
  do {
    auVar38 = auVar238._0_16_;
    auVar244 = ZEXT1664(auVar38);
    auVar48 = vshufps_avx(auVar38,auVar38,0x50);
    auVar226._8_4_ = 0x3f800000;
    auVar226._0_8_ = &DAT_3f8000003f800000;
    auVar226._12_4_ = 0x3f800000;
    auVar231._16_4_ = 0x3f800000;
    auVar231._0_16_ = auVar226;
    auVar231._20_4_ = 0x3f800000;
    auVar231._24_4_ = 0x3f800000;
    auVar231._28_4_ = 0x3f800000;
    auVar47 = vsubps_avx(auVar226,auVar48);
    fVar203 = auVar48._0_4_;
    auVar114._0_4_ = local_1b8._0_4_ * fVar203;
    fVar88 = auVar48._4_4_;
    auVar114._4_4_ = local_1b8._4_4_ * fVar88;
    fVar198 = auVar48._8_4_;
    auVar114._8_4_ = local_1b8._8_4_ * fVar198;
    fVar199 = auVar48._12_4_;
    auVar114._12_4_ = local_1b8._12_4_ * fVar199;
    auVar129._0_4_ = local_1c8._0_4_ * fVar203;
    auVar129._4_4_ = local_1c8._4_4_ * fVar88;
    auVar129._8_4_ = local_1c8._8_4_ * fVar198;
    auVar129._12_4_ = local_1c8._12_4_ * fVar199;
    auVar140._0_4_ = local_1d8._0_4_ * fVar203;
    auVar140._4_4_ = local_1d8._4_4_ * fVar88;
    auVar140._8_4_ = local_1d8._8_4_ * fVar198;
    auVar140._12_4_ = local_1d8._12_4_ * fVar199;
    auVar93._0_4_ = local_1e8._0_4_ * fVar203;
    auVar93._4_4_ = local_1e8._4_4_ * fVar88;
    auVar93._8_4_ = local_1e8._8_4_ * fVar198;
    auVar93._12_4_ = local_1e8._12_4_ * fVar199;
    auVar46 = vfmadd231ps_fma(auVar114,auVar47,local_178);
    auVar45 = vfmadd231ps_fma(auVar129,auVar47,local_188);
    auVar44 = vfmadd231ps_avx512vl(auVar140,auVar47,local_198);
    auVar47 = vfmadd231ps_fma(auVar93,local_1a8,auVar47);
    auVar48 = vmovshdup_avx(auVar35);
    fVar88 = auVar35._0_4_;
    fVar203 = (auVar48._0_4_ - fVar88) * 0.04761905;
    auVar166._4_4_ = fVar88;
    auVar166._0_4_ = fVar88;
    auVar166._8_4_ = fVar88;
    auVar166._12_4_ = fVar88;
    auVar166._16_4_ = fVar88;
    auVar166._20_4_ = fVar88;
    auVar166._24_4_ = fVar88;
    auVar166._28_4_ = fVar88;
    auVar110._0_8_ = auVar48._0_8_;
    auVar110._8_8_ = auVar110._0_8_;
    auVar110._16_8_ = auVar110._0_8_;
    auVar110._24_8_ = auVar110._0_8_;
    auVar56 = vsubps_avx(auVar110,auVar166);
    uVar89 = auVar46._0_4_;
    auVar111._4_4_ = uVar89;
    auVar111._0_4_ = uVar89;
    auVar111._8_4_ = uVar89;
    auVar111._12_4_ = uVar89;
    auVar111._16_4_ = uVar89;
    auVar111._20_4_ = uVar89;
    auVar111._24_4_ = uVar89;
    auVar111._28_4_ = uVar89;
    auVar185._8_4_ = 1;
    auVar185._0_8_ = 0x100000001;
    auVar185._12_4_ = 1;
    auVar185._16_4_ = 1;
    auVar185._20_4_ = 1;
    auVar185._24_4_ = 1;
    auVar185._28_4_ = 1;
    auVar71 = ZEXT1632(auVar46);
    auVar54 = vpermps_avx2(auVar185,auVar71);
    auVar61 = vbroadcastss_avx512vl(auVar45);
    auVar72 = ZEXT1632(auVar45);
    auVar55 = vpermps_avx512vl(auVar185,auVar72);
    auVar62 = vbroadcastss_avx512vl(auVar44);
    auVar69 = ZEXT1632(auVar44);
    auVar63 = vpermps_avx512vl(auVar185,auVar69);
    auVar64 = vbroadcastss_avx512vl(auVar47);
    auVar68 = ZEXT1632(auVar47);
    auVar65 = vpermps_avx512vl(auVar185,auVar68);
    auVar186._4_4_ = fVar203;
    auVar186._0_4_ = fVar203;
    auVar186._8_4_ = fVar203;
    auVar186._12_4_ = fVar203;
    auVar186._16_4_ = fVar203;
    auVar186._20_4_ = fVar203;
    auVar186._24_4_ = fVar203;
    auVar186._28_4_ = fVar203;
    auVar53 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar66 = vpermps_avx512vl(auVar53,auVar71);
    auVar150._8_4_ = 3;
    auVar150._0_8_ = 0x300000003;
    auVar150._12_4_ = 3;
    auVar150._16_4_ = 3;
    auVar150._20_4_ = 3;
    auVar150._24_4_ = 3;
    auVar150._28_4_ = 3;
    auVar67 = vpermps_avx512vl(auVar150,auVar71);
    auVar51 = vpermps_avx512vl(auVar53,auVar72);
    auVar71 = vpermps_avx2(auVar150,auVar72);
    auVar52 = vpermps_avx512vl(auVar53,auVar69);
    auVar72 = vpermps_avx2(auVar150,auVar69);
    auVar53 = vpermps_avx512vl(auVar53,auVar68);
    auVar68 = vpermps_avx512vl(auVar150,auVar68);
    auVar48 = vfmadd132ps_fma(auVar56,auVar166,_DAT_02020f20);
    auVar56 = vsubps_avx(auVar231,ZEXT1632(auVar48));
    auVar69 = vmulps_avx512vl(auVar61,ZEXT1632(auVar48));
    auVar73 = ZEXT1632(auVar48);
    auVar70 = vmulps_avx512vl(auVar55,auVar73);
    auVar47 = vfmadd231ps_fma(auVar69,auVar56,auVar111);
    auVar46 = vfmadd231ps_fma(auVar70,auVar56,auVar54);
    auVar69 = vmulps_avx512vl(auVar62,auVar73);
    auVar70 = vmulps_avx512vl(auVar63,auVar73);
    auVar61 = vfmadd231ps_avx512vl(auVar69,auVar56,auVar61);
    auVar55 = vfmadd231ps_avx512vl(auVar70,auVar56,auVar55);
    auVar69 = vmulps_avx512vl(auVar64,auVar73);
    auVar70 = ZEXT1632(auVar48);
    auVar65 = vmulps_avx512vl(auVar65,auVar70);
    auVar62 = vfmadd231ps_avx512vl(auVar69,auVar56,auVar62);
    auVar63 = vfmadd231ps_avx512vl(auVar65,auVar56,auVar63);
    fVar198 = auVar48._0_4_;
    fVar199 = auVar48._4_4_;
    auVar18._4_4_ = fVar199 * auVar61._4_4_;
    auVar18._0_4_ = fVar198 * auVar61._0_4_;
    fVar200 = auVar48._8_4_;
    auVar18._8_4_ = fVar200 * auVar61._8_4_;
    fVar201 = auVar48._12_4_;
    auVar18._12_4_ = fVar201 * auVar61._12_4_;
    auVar18._16_4_ = auVar61._16_4_ * 0.0;
    auVar18._20_4_ = auVar61._20_4_ * 0.0;
    auVar18._24_4_ = auVar61._24_4_ * 0.0;
    auVar18._28_4_ = fVar88;
    auVar19._4_4_ = fVar199 * auVar55._4_4_;
    auVar19._0_4_ = fVar198 * auVar55._0_4_;
    auVar19._8_4_ = fVar200 * auVar55._8_4_;
    auVar19._12_4_ = fVar201 * auVar55._12_4_;
    auVar19._16_4_ = auVar55._16_4_ * 0.0;
    auVar19._20_4_ = auVar55._20_4_ * 0.0;
    auVar19._24_4_ = auVar55._24_4_ * 0.0;
    auVar19._28_4_ = auVar54._28_4_;
    auVar47 = vfmadd231ps_fma(auVar18,auVar56,ZEXT1632(auVar47));
    auVar46 = vfmadd231ps_fma(auVar19,auVar56,ZEXT1632(auVar46));
    auVar99._0_4_ = fVar198 * auVar62._0_4_;
    auVar99._4_4_ = fVar199 * auVar62._4_4_;
    auVar99._8_4_ = fVar200 * auVar62._8_4_;
    auVar99._12_4_ = fVar201 * auVar62._12_4_;
    auVar99._16_4_ = auVar62._16_4_ * 0.0;
    auVar99._20_4_ = auVar62._20_4_ * 0.0;
    auVar99._24_4_ = auVar62._24_4_ * 0.0;
    auVar99._28_4_ = 0;
    auVar20._4_4_ = fVar199 * auVar63._4_4_;
    auVar20._0_4_ = fVar198 * auVar63._0_4_;
    auVar20._8_4_ = fVar200 * auVar63._8_4_;
    auVar20._12_4_ = fVar201 * auVar63._12_4_;
    auVar20._16_4_ = auVar63._16_4_ * 0.0;
    auVar20._20_4_ = auVar63._20_4_ * 0.0;
    auVar20._24_4_ = auVar63._24_4_ * 0.0;
    auVar20._28_4_ = auVar62._28_4_;
    auVar45 = vfmadd231ps_fma(auVar99,auVar56,auVar61);
    auVar44 = vfmadd231ps_fma(auVar20,auVar56,auVar55);
    auVar21._28_4_ = auVar55._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar201 * auVar44._12_4_,
                            CONCAT48(fVar200 * auVar44._8_4_,
                                     CONCAT44(fVar199 * auVar44._4_4_,fVar198 * auVar44._0_4_))));
    auVar43 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar201 * auVar45._12_4_,
                                                 CONCAT48(fVar200 * auVar45._8_4_,
                                                          CONCAT44(fVar199 * auVar45._4_4_,
                                                                   fVar198 * auVar45._0_4_)))),
                              auVar56,ZEXT1632(auVar47));
    auVar42 = vfmadd231ps_fma(auVar21,auVar56,ZEXT1632(auVar46));
    auVar54 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar47));
    auVar61 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar46));
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar54 = vmulps_avx512vl(auVar54,auVar55);
    auVar61 = vmulps_avx512vl(auVar61,auVar55);
    auVar178._0_4_ = fVar203 * auVar54._0_4_;
    auVar178._4_4_ = fVar203 * auVar54._4_4_;
    auVar178._8_4_ = fVar203 * auVar54._8_4_;
    auVar178._12_4_ = fVar203 * auVar54._12_4_;
    auVar178._16_4_ = fVar203 * auVar54._16_4_;
    auVar178._20_4_ = fVar203 * auVar54._20_4_;
    auVar178._24_4_ = fVar203 * auVar54._24_4_;
    auVar178._28_4_ = 0;
    auVar54 = vmulps_avx512vl(auVar186,auVar61);
    auVar45 = vxorps_avx512vl(auVar64._0_16_,auVar64._0_16_);
    auVar61 = vpermt2ps_avx512vl(ZEXT1632(auVar43),_DAT_0205fd20,ZEXT1632(auVar45));
    auVar62 = vpermt2ps_avx512vl(ZEXT1632(auVar42),_DAT_0205fd20,ZEXT1632(auVar45));
    auVar100._0_4_ = auVar178._0_4_ + auVar43._0_4_;
    auVar100._4_4_ = auVar178._4_4_ + auVar43._4_4_;
    auVar100._8_4_ = auVar178._8_4_ + auVar43._8_4_;
    auVar100._12_4_ = auVar178._12_4_ + auVar43._12_4_;
    auVar100._16_4_ = auVar178._16_4_ + 0.0;
    auVar100._20_4_ = auVar178._20_4_ + 0.0;
    auVar100._24_4_ = auVar178._24_4_ + 0.0;
    auVar100._28_4_ = 0;
    auVar73 = ZEXT1632(auVar45);
    auVar63 = vpermt2ps_avx512vl(auVar178,_DAT_0205fd20,auVar73);
    auVar64 = vaddps_avx512vl(ZEXT1632(auVar42),auVar54);
    auVar65 = vpermt2ps_avx512vl(auVar54,_DAT_0205fd20,auVar73);
    auVar54 = vsubps_avx(auVar61,auVar63);
    auVar63 = vsubps_avx512vl(auVar62,auVar65);
    auVar65 = vmulps_avx512vl(auVar51,auVar70);
    auVar69 = vmulps_avx512vl(auVar71,auVar70);
    auVar65 = vfmadd231ps_avx512vl(auVar65,auVar56,auVar66);
    auVar66 = vfmadd231ps_avx512vl(auVar69,auVar56,auVar67);
    auVar67 = vmulps_avx512vl(auVar52,auVar70);
    auVar69 = vmulps_avx512vl(auVar72,auVar70);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar56,auVar51);
    auVar71 = vfmadd231ps_avx512vl(auVar69,auVar56,auVar71);
    auVar53 = vmulps_avx512vl(auVar53,auVar70);
    auVar51 = vmulps_avx512vl(auVar68,auVar70);
    auVar47 = vfmadd231ps_fma(auVar53,auVar56,auVar52);
    auVar46 = vfmadd231ps_fma(auVar51,auVar56,auVar72);
    auVar53 = vmulps_avx512vl(auVar70,auVar67);
    auVar51 = vmulps_avx512vl(ZEXT1632(auVar48),auVar71);
    auVar65 = vfmadd231ps_avx512vl(auVar53,auVar56,auVar65);
    auVar53 = vfmadd231ps_avx512vl(auVar51,auVar56,auVar66);
    auVar66 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar201 * auVar47._12_4_,
                                            CONCAT48(fVar200 * auVar47._8_4_,
                                                     CONCAT44(fVar199 * auVar47._4_4_,
                                                              fVar198 * auVar47._0_4_)))),auVar56,
                         auVar67);
    auVar71 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar201 * auVar46._12_4_,
                                            CONCAT48(fVar200 * auVar46._8_4_,
                                                     CONCAT44(fVar199 * auVar46._4_4_,
                                                              fVar198 * auVar46._0_4_)))),auVar56,
                         auVar71);
    auVar22._4_4_ = fVar199 * auVar66._4_4_;
    auVar22._0_4_ = fVar198 * auVar66._0_4_;
    auVar22._8_4_ = fVar200 * auVar66._8_4_;
    auVar22._12_4_ = fVar201 * auVar66._12_4_;
    auVar22._16_4_ = auVar66._16_4_ * 0.0;
    auVar22._20_4_ = auVar66._20_4_ * 0.0;
    auVar22._24_4_ = auVar66._24_4_ * 0.0;
    auVar22._28_4_ = auVar72._28_4_;
    auVar23._4_4_ = fVar199 * auVar71._4_4_;
    auVar23._0_4_ = fVar198 * auVar71._0_4_;
    auVar23._8_4_ = fVar200 * auVar71._8_4_;
    auVar23._12_4_ = fVar201 * auVar71._12_4_;
    auVar23._16_4_ = auVar71._16_4_ * 0.0;
    auVar23._20_4_ = auVar71._20_4_ * 0.0;
    auVar23._24_4_ = auVar71._24_4_ * 0.0;
    auVar23._28_4_ = auVar52._28_4_;
    auVar72 = vfmadd231ps_avx512vl(auVar22,auVar56,auVar65);
    auVar67 = vfmadd231ps_avx512vl(auVar23,auVar53,auVar56);
    auVar56 = vsubps_avx512vl(auVar66,auVar65);
    auVar71 = vsubps_avx512vl(auVar71,auVar53);
    auVar56 = vmulps_avx512vl(auVar56,auVar55);
    auVar71 = vmulps_avx512vl(auVar71,auVar55);
    fVar88 = fVar203 * auVar56._0_4_;
    fVar198 = fVar203 * auVar56._4_4_;
    auVar24._4_4_ = fVar198;
    auVar24._0_4_ = fVar88;
    fVar199 = fVar203 * auVar56._8_4_;
    auVar24._8_4_ = fVar199;
    fVar200 = fVar203 * auVar56._12_4_;
    auVar24._12_4_ = fVar200;
    fVar201 = fVar203 * auVar56._16_4_;
    auVar24._16_4_ = fVar201;
    fVar202 = fVar203 * auVar56._20_4_;
    auVar24._20_4_ = fVar202;
    fVar203 = fVar203 * auVar56._24_4_;
    auVar24._24_4_ = fVar203;
    auVar24._28_4_ = auVar56._28_4_;
    auVar71 = vmulps_avx512vl(auVar186,auVar71);
    auVar55 = vpermt2ps_avx512vl(auVar72,_DAT_0205fd20,auVar73);
    auVar65 = vpermt2ps_avx512vl(auVar67,_DAT_0205fd20,auVar73);
    auVar187._0_4_ = auVar72._0_4_ + fVar88;
    auVar187._4_4_ = auVar72._4_4_ + fVar198;
    auVar187._8_4_ = auVar72._8_4_ + fVar199;
    auVar187._12_4_ = auVar72._12_4_ + fVar200;
    auVar187._16_4_ = auVar72._16_4_ + fVar201;
    auVar187._20_4_ = auVar72._20_4_ + fVar202;
    auVar187._24_4_ = auVar72._24_4_ + fVar203;
    auVar187._28_4_ = auVar72._28_4_ + auVar56._28_4_;
    auVar56 = vpermt2ps_avx512vl(auVar24,_DAT_0205fd20,ZEXT1632(auVar45));
    auVar53 = vaddps_avx512vl(auVar67,auVar71);
    auVar71 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,ZEXT1632(auVar45));
    auVar56 = vsubps_avx(auVar55,auVar56);
    auVar71 = vsubps_avx512vl(auVar65,auVar71);
    auVar120 = ZEXT1632(auVar43);
    auVar66 = vsubps_avx512vl(auVar72,auVar120);
    auVar133 = ZEXT1632(auVar42);
    auVar51 = vsubps_avx512vl(auVar67,auVar133);
    auVar52 = vsubps_avx512vl(auVar55,auVar61);
    auVar66 = vaddps_avx512vl(auVar66,auVar52);
    auVar52 = vsubps_avx512vl(auVar65,auVar62);
    auVar51 = vaddps_avx512vl(auVar51,auVar52);
    auVar52 = vmulps_avx512vl(auVar133,auVar66);
    auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar120,auVar51);
    auVar68 = vmulps_avx512vl(auVar64,auVar66);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar100,auVar51);
    auVar69 = vmulps_avx512vl(auVar63,auVar66);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar54,auVar51);
    auVar70 = vmulps_avx512vl(auVar62,auVar66);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar61,auVar51);
    auVar73 = vmulps_avx512vl(auVar67,auVar66);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar72,auVar51);
    auVar74 = vmulps_avx512vl(auVar53,auVar66);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar187,auVar51);
    auVar75 = vmulps_avx512vl(auVar71,auVar66);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar56,auVar51);
    auVar66 = vmulps_avx512vl(auVar65,auVar66);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar55,auVar51);
    auVar51 = vminps_avx512vl(auVar52,auVar68);
    auVar52 = vmaxps_avx512vl(auVar52,auVar68);
    auVar68 = vminps_avx512vl(auVar69,auVar70);
    auVar51 = vminps_avx512vl(auVar51,auVar68);
    auVar68 = vmaxps_avx512vl(auVar69,auVar70);
    auVar52 = vmaxps_avx512vl(auVar52,auVar68);
    auVar68 = vminps_avx512vl(auVar73,auVar74);
    auVar69 = vmaxps_avx512vl(auVar73,auVar74);
    auVar70 = vminps_avx512vl(auVar75,auVar66);
    auVar68 = vminps_avx512vl(auVar68,auVar70);
    auVar51 = vminps_avx512vl(auVar51,auVar68);
    auVar66 = vmaxps_avx512vl(auVar75,auVar66);
    auVar66 = vmaxps_avx512vl(auVar69,auVar66);
    auVar66 = vmaxps_avx512vl(auVar52,auVar66);
    uVar12 = vcmpps_avx512vl(auVar51,local_78,2);
    uVar13 = vcmpps_avx512vl(auVar66,local_98,5);
    uVar29 = 0;
    bVar25 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar25 != 0) {
      auVar66 = vsubps_avx512vl(auVar61,auVar120);
      auVar51 = vsubps_avx512vl(auVar62,auVar133);
      auVar52 = vsubps_avx512vl(auVar55,auVar72);
      auVar66 = vaddps_avx512vl(auVar66,auVar52);
      auVar52 = vsubps_avx512vl(auVar65,auVar67);
      auVar51 = vaddps_avx512vl(auVar51,auVar52);
      auVar52 = vmulps_avx512vl(auVar133,auVar66);
      auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar51,auVar120);
      auVar64 = vmulps_avx512vl(auVar64,auVar66);
      auVar64 = vfnmadd213ps_avx512vl(auVar100,auVar51,auVar64);
      auVar63 = vmulps_avx512vl(auVar63,auVar66);
      auVar63 = vfnmadd213ps_avx512vl(auVar54,auVar51,auVar63);
      auVar54 = vmulps_avx512vl(auVar62,auVar66);
      auVar62 = vfnmadd231ps_avx512vl(auVar54,auVar51,auVar61);
      auVar54 = vmulps_avx512vl(auVar67,auVar66);
      auVar67 = vfnmadd231ps_avx512vl(auVar54,auVar51,auVar72);
      auVar54 = vmulps_avx512vl(auVar53,auVar66);
      auVar53 = vfnmadd213ps_avx512vl(auVar187,auVar51,auVar54);
      auVar54 = vmulps_avx512vl(auVar71,auVar66);
      auVar68 = vfnmadd213ps_avx512vl(auVar56,auVar51,auVar54);
      auVar56 = vmulps_avx512vl(auVar65,auVar66);
      auVar65 = vfnmadd231ps_avx512vl(auVar56,auVar55,auVar51);
      auVar54 = vminps_avx(auVar52,auVar64);
      auVar56 = vmaxps_avx(auVar52,auVar64);
      auVar61 = vminps_avx(auVar63,auVar62);
      auVar61 = vminps_avx(auVar54,auVar61);
      auVar54 = vmaxps_avx(auVar63,auVar62);
      auVar56 = vmaxps_avx(auVar56,auVar54);
      auVar72 = vminps_avx(auVar67,auVar53);
      auVar54 = vmaxps_avx(auVar67,auVar53);
      auVar55 = vminps_avx(auVar68,auVar65);
      auVar72 = vminps_avx(auVar72,auVar55);
      auVar72 = vminps_avx(auVar61,auVar72);
      auVar61 = vmaxps_avx(auVar68,auVar65);
      auVar54 = vmaxps_avx(auVar54,auVar61);
      auVar56 = vmaxps_avx(auVar56,auVar54);
      uVar12 = vcmpps_avx512vl(auVar56,local_98,5);
      uVar13 = vcmpps_avx512vl(auVar72,local_78,2);
      uVar29 = (uint)(bVar25 & (byte)uVar12 & (byte)uVar13);
    }
    if (uVar29 != 0) {
      auStack_168[uVar27] = uVar29;
      uVar12 = vmovlps_avx(auVar35);
      *(undefined8 *)(&uStack_d8 + uVar27 * 2) = uVar12;
      uVar34 = vmovlps_avx512f(auVar38);
      auStack_58[uVar27] = uVar34;
      uVar27 = (ulong)((int)uVar27 + 1);
    }
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar240 = ZEXT1664(auVar35);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM18 = ZEXT3264(auVar56);
    auVar241 = ZEXT464(0x3f800000);
    auVar69._16_16_ = auVar56._16_16_;
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar242 = ZEXT1664(auVar35);
    auVar35 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
    auVar239 = ZEXT1664(auVar35);
    auVar243 = ZEXT1664(local_308);
    auVar245 = ZEXT1664(local_318);
    do {
      auVar35 = auVar242._0_16_;
      if ((int)uVar27 == 0) {
        fVar203 = (ray->super_RayK<1>).tfar;
        auVar17._4_4_ = fVar203;
        auVar17._0_4_ = fVar203;
        auVar17._8_4_ = fVar203;
        auVar17._12_4_ = fVar203;
        auVar17._16_4_ = fVar203;
        auVar17._20_4_ = fVar203;
        auVar17._24_4_ = fVar203;
        auVar17._28_4_ = fVar203;
        uVar12 = vcmpps_avx512vl(local_b8,auVar17,2);
        uVar32 = (uint)uVar33 & (uint)uVar12;
        uVar33 = (ulong)uVar32;
        if (uVar32 == 0) {
          return;
        }
        goto LAB_01dcc210;
      }
      uVar26 = (int)uVar27 - 1;
      uVar28 = (ulong)uVar26;
      uVar29 = (&uStack_d8)[uVar28 * 2];
      fVar203 = afStack_d4[uVar28 * 2];
      uVar5 = auStack_168[uVar28];
      auVar236._8_8_ = 0;
      auVar236._0_8_ = auStack_58[uVar28];
      auVar238 = ZEXT1664(auVar236);
      lVar31 = 0;
      for (uVar34 = (ulong)uVar5; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar30 = uVar5 - 1 & uVar5;
      auStack_168[uVar28] = uVar30;
      if (uVar30 == 0) {
        uVar27 = (ulong)uVar26;
      }
      auVar47 = vpxord_avx512vl(auVar244._0_16_,auVar244._0_16_);
      auVar48 = vcvtsi2ss_avx512f(auVar47,lVar31);
      auVar46 = vmulss_avx512f(auVar48,SUB6416(ZEXT464(0x3e124925),0));
      lVar31 = lVar31 + 1;
      auVar48 = vpxord_avx512vl(auVar47,auVar47);
      auVar48 = vcvtsi2ss_avx512f(auVar48,lVar31);
      auVar48 = vmulss_avx512f(auVar48,SUB6416(ZEXT464(0x3e124925),0));
      auVar45 = auVar241._0_16_;
      auVar47 = vsubss_avx512f(auVar45,auVar46);
      local_2f8 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar46._0_4_)),ZEXT416(uVar29),auVar47);
      auVar47 = vsubss_avx512f(auVar45,auVar48);
      auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar48._0_4_)),ZEXT416(uVar29),auVar47);
      fVar88 = auVar48._0_4_;
      fVar198 = local_2f8._0_4_;
      fVar203 = fVar88 - fVar198;
      vucomiss_avx512f(ZEXT416((uint)fVar203));
      if (uVar5 == 0 || lVar31 == 0) break;
      auVar244 = ZEXT1664(auVar236);
      auVar47 = vshufps_avx(auVar236,auVar236,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar203));
      auVar43 = vsubps_avx512vl(auVar35,auVar47);
      fVar199 = auVar47._0_4_;
      auVar115._0_4_ = fVar199 * (float)local_1b8._0_4_;
      fVar200 = auVar47._4_4_;
      auVar115._4_4_ = fVar200 * (float)local_1b8._4_4_;
      fVar201 = auVar47._8_4_;
      auVar115._8_4_ = fVar201 * fStack_1b0;
      fVar202 = auVar47._12_4_;
      auVar115._12_4_ = fVar202 * fStack_1ac;
      auVar130._0_4_ = fVar199 * (float)local_1c8._0_4_;
      auVar130._4_4_ = fVar200 * (float)local_1c8._4_4_;
      auVar130._8_4_ = fVar201 * fStack_1c0;
      auVar130._12_4_ = fVar202 * fStack_1bc;
      auVar141._0_4_ = fVar199 * (float)local_1d8._0_4_;
      auVar141._4_4_ = fVar200 * (float)local_1d8._4_4_;
      auVar141._8_4_ = fVar201 * fStack_1d0;
      auVar141._12_4_ = fVar202 * fStack_1cc;
      auVar94._0_4_ = fVar199 * (float)local_1e8._0_4_;
      auVar94._4_4_ = fVar200 * (float)local_1e8._4_4_;
      auVar94._8_4_ = fVar201 * fStack_1e0;
      auVar94._12_4_ = fVar202 * fStack_1dc;
      auVar47 = vfmadd231ps_fma(auVar115,auVar43,local_178);
      auVar46 = vfmadd231ps_fma(auVar130,auVar43,local_188);
      auVar44 = vfmadd231ps_fma(auVar141,auVar43,local_198);
      auVar43 = vfmadd231ps_fma(auVar94,auVar43,local_1a8);
      auVar112._16_16_ = auVar47;
      auVar112._0_16_ = auVar47;
      auVar121._16_16_ = auVar46;
      auVar121._0_16_ = auVar46;
      auVar134._16_16_ = auVar44;
      auVar134._0_16_ = auVar44;
      auVar151._4_4_ = fVar198;
      auVar151._0_4_ = fVar198;
      auVar151._8_4_ = fVar198;
      auVar151._12_4_ = fVar198;
      auVar151._20_4_ = fVar88;
      auVar151._16_4_ = fVar88;
      auVar151._24_4_ = fVar88;
      auVar151._28_4_ = fVar88;
      auVar56 = vsubps_avx(auVar121,auVar112);
      auVar46 = vfmadd213ps_fma(auVar56,auVar151,auVar112);
      auVar56 = vsubps_avx(auVar134,auVar121);
      auVar42 = vfmadd213ps_fma(auVar56,auVar151,auVar121);
      auVar47 = vsubps_avx(auVar43,auVar44);
      auVar122._16_16_ = auVar47;
      auVar122._0_16_ = auVar47;
      auVar47 = vfmadd213ps_fma(auVar122,auVar151,auVar134);
      auVar56 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar46));
      auVar46 = vfmadd213ps_fma(auVar56,auVar151,ZEXT1632(auVar46));
      auVar56 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar42));
      auVar47 = vfmadd213ps_fma(auVar56,auVar151,ZEXT1632(auVar42));
      auVar56 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar46));
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar56,auVar151);
      auVar56 = vmulps_avx512vl(auVar56,in_ZMM18._0_32_);
      auVar69._16_16_ = auVar56._16_16_;
      auVar47 = vmulss_avx512f(ZEXT416((uint)fVar203),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar88 = auVar47._0_4_;
      auVar142._0_8_ =
           CONCAT44(auVar101._4_4_ + fVar88 * auVar56._4_4_,auVar101._0_4_ + fVar88 * auVar56._0_4_)
      ;
      auVar142._8_4_ = auVar101._8_4_ + fVar88 * auVar56._8_4_;
      auVar142._12_4_ = auVar101._12_4_ + fVar88 * auVar56._12_4_;
      auVar116._0_4_ = fVar88 * auVar56._16_4_;
      auVar116._4_4_ = fVar88 * auVar56._20_4_;
      auVar116._8_4_ = fVar88 * auVar56._24_4_;
      auVar116._12_4_ = fVar88 * auVar56._28_4_;
      auVar49 = vsubps_avx((undefined1  [16])0x0,auVar116);
      auVar36 = vshufpd_avx(auVar101,auVar101,3);
      auVar37 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar47 = vsubps_avx(auVar36,auVar101);
      auVar46 = vsubps_avx(auVar37,(undefined1  [16])0x0);
      auVar155._0_4_ = auVar46._0_4_ + auVar47._0_4_;
      auVar155._4_4_ = auVar46._4_4_ + auVar47._4_4_;
      auVar155._8_4_ = auVar46._8_4_ + auVar47._8_4_;
      auVar155._12_4_ = auVar46._12_4_ + auVar47._12_4_;
      auVar47 = vshufps_avx(auVar101,auVar101,0xb1);
      auVar46 = vshufps_avx(auVar142,auVar142,0xb1);
      auVar44 = vshufps_avx(auVar49,auVar49,0xb1);
      auVar43 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar218._4_4_ = auVar155._0_4_;
      auVar218._0_4_ = auVar155._0_4_;
      auVar218._8_4_ = auVar155._0_4_;
      auVar218._12_4_ = auVar155._0_4_;
      auVar42 = vshufps_avx(auVar155,auVar155,0x55);
      fVar88 = auVar42._0_4_;
      auVar171._0_4_ = auVar47._0_4_ * fVar88;
      fVar198 = auVar42._4_4_;
      auVar171._4_4_ = auVar47._4_4_ * fVar198;
      fVar199 = auVar42._8_4_;
      auVar171._8_4_ = auVar47._8_4_ * fVar199;
      fVar200 = auVar42._12_4_;
      auVar171._12_4_ = auVar47._12_4_ * fVar200;
      auVar182._0_4_ = auVar46._0_4_ * fVar88;
      auVar182._4_4_ = auVar46._4_4_ * fVar198;
      auVar182._8_4_ = auVar46._8_4_ * fVar199;
      auVar182._12_4_ = auVar46._12_4_ * fVar200;
      auVar190._0_4_ = auVar44._0_4_ * fVar88;
      auVar190._4_4_ = auVar44._4_4_ * fVar198;
      auVar190._8_4_ = auVar44._8_4_ * fVar199;
      auVar190._12_4_ = auVar44._12_4_ * fVar200;
      auVar156._0_4_ = auVar43._0_4_ * fVar88;
      auVar156._4_4_ = auVar43._4_4_ * fVar198;
      auVar156._8_4_ = auVar43._8_4_ * fVar199;
      auVar156._12_4_ = auVar43._12_4_ * fVar200;
      auVar47 = vfmadd231ps_fma(auVar171,auVar218,auVar101);
      auVar46 = vfmadd231ps_fma(auVar182,auVar218,auVar142);
      auVar42 = vfmadd231ps_fma(auVar190,auVar218,auVar49);
      auVar92 = vfmadd231ps_fma(auVar156,(undefined1  [16])0x0,auVar218);
      auVar38 = vshufpd_avx(auVar47,auVar47,1);
      auVar39 = vshufpd_avx(auVar46,auVar46,1);
      auVar40 = vshufpd_avx(auVar42,auVar42,1);
      auVar41 = vshufpd_avx(auVar92,auVar92,1);
      auVar44 = vminss_avx(auVar47,auVar46);
      auVar47 = vmaxss_avx(auVar46,auVar47);
      auVar43 = vminss_avx(auVar42,auVar92);
      auVar46 = vmaxss_avx(auVar92,auVar42);
      auVar43 = vminss_avx(auVar44,auVar43);
      auVar47 = vmaxss_avx(auVar46,auVar47);
      auVar42 = vminss_avx(auVar38,auVar39);
      auVar46 = vmaxss_avx(auVar39,auVar38);
      auVar38 = vminss_avx(auVar40,auVar41);
      auVar44 = vmaxss_avx(auVar41,auVar40);
      auVar42 = vminss_avx(auVar42,auVar38);
      auVar46 = vmaxss_avx(auVar44,auVar46);
      vucomiss_avx512f(auVar43);
      fVar198 = auVar46._0_4_;
      fVar88 = auVar47._0_4_;
      if (((uint)uVar27 < 5) || (fVar198 <= -0.0001)) {
        uVar12 = vcmpps_avx512vl(auVar42,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar13 = vcmpps_avx512vl(auVar43,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar88 & ((byte)uVar13 | (byte)uVar12)) != 0) goto LAB_01dcd09d;
        uVar12 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar46,5);
        uVar13 = vcmpps_avx512vl(auVar42,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar13 | (ushort)uVar12) & 1) == 0) goto LAB_01dcd09d;
        bVar10 = true;
        auVar238 = ZEXT1664(auVar236);
      }
      else {
LAB_01dcd09d:
        uVar12 = vcmpss_avx512f(auVar43,auVar239._0_16_,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        iVar87 = auVar241._0_4_;
        fVar199 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar87);
        uVar12 = vcmpss_avx512f(auVar47,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar200 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar87);
        auVar69._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar76._4_28_ = auVar69._4_28_;
        auVar76._0_4_ = (uint)(fVar199 == fVar200) * 0x7f800000;
        auVar38 = auVar76._0_16_;
        auVar78._16_16_ = auVar69._16_16_;
        auVar78._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar77._4_28_ = auVar78._4_28_;
        auVar77._0_4_ = (uint)(fVar199 == fVar200) * -0x800000;
        auVar44 = auVar77._0_16_;
        uVar12 = vcmpss_avx512f(auVar42,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar201 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar87);
        auVar39 = ZEXT416(0xbf800000);
        if ((fVar199 != fVar201) || (NAN(fVar199) || NAN(fVar201))) {
          fVar202 = auVar42._0_4_;
          fVar199 = auVar43._0_4_;
          bVar10 = fVar202 == fVar199;
          if ((!bVar10) || (NAN(fVar202) || NAN(fVar199))) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar43 = vxorps_avx512vl(auVar43,auVar16);
            auVar232._0_4_ = auVar43._0_4_ / (fVar202 - fVar199);
            auVar232._4_12_ = auVar43._4_12_;
            auVar43 = vsubss_avx512f(auVar45,auVar232);
            auVar39 = vxorps_avx512vl(auVar39,auVar39);
            auVar42 = vfmadd213ss_avx512f(auVar43,auVar39,auVar232);
            auVar43 = auVar42;
          }
          else {
            auVar39 = vxorps_avx512vl(auVar39,auVar39);
            vucomiss_avx512f(auVar39);
            auVar80._16_16_ = auVar69._16_16_;
            auVar80._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar79._4_28_ = auVar80._4_28_;
            auVar79._0_4_ = (uint)bVar10 * auVar39._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar42 = auVar79._0_16_;
            auVar43 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar38 = vminss_avx(auVar38,auVar42);
          auVar44 = vmaxss_avx(auVar43,auVar44);
        }
        else {
          auVar39 = vxorps_avx512vl(auVar39,auVar39);
        }
        auVar239 = ZEXT1664(auVar39);
        auVar238 = ZEXT1664(auVar236);
        uVar12 = vcmpss_avx512f(auVar46,auVar39,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar199 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar87);
        if ((fVar200 != fVar199) || (NAN(fVar200) || NAN(fVar199))) {
          bVar10 = fVar198 == fVar88;
          if ((!bVar10) || (NAN(fVar198) || NAN(fVar88))) {
            auVar15._8_4_ = 0x80000000;
            auVar15._0_8_ = 0x8000000080000000;
            auVar15._12_4_ = 0x80000000;
            auVar47 = vxorps_avx512vl(auVar47,auVar15);
            auVar191._0_4_ = auVar47._0_4_ / (fVar198 - fVar88);
            auVar191._4_12_ = auVar47._4_12_;
            auVar47 = vsubss_avx512f(auVar45,auVar191);
            auVar46 = vfmadd213ss_avx512f(auVar47,auVar39,auVar191);
            auVar47 = auVar46;
          }
          else {
            vucomiss_avx512f(auVar39);
            auVar82._16_16_ = auVar69._16_16_;
            auVar82._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar81._4_28_ = auVar82._4_28_;
            auVar81._0_4_ = (uint)bVar10 * auVar39._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar46 = auVar81._0_16_;
            auVar47 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar38 = vminss_avx(auVar38,auVar46);
          auVar44 = vmaxss_avx(auVar47,auVar44);
        }
        bVar10 = fVar201 != fVar199;
        auVar47 = vminss_avx512f(auVar38,auVar45);
        auVar84._16_16_ = auVar69._16_16_;
        auVar84._0_16_ = auVar38;
        auVar83._4_28_ = auVar84._4_28_;
        auVar83._0_4_ = (uint)bVar10 * auVar47._0_4_ + (uint)!bVar10 * auVar38._0_4_;
        auVar47 = vmaxss_avx512f(auVar45,auVar44);
        auVar86._16_16_ = auVar69._16_16_;
        auVar86._0_16_ = auVar44;
        auVar85._4_28_ = auVar86._4_28_;
        auVar85._0_4_ = (uint)bVar10 * auVar47._0_4_ + (uint)!bVar10 * auVar44._0_4_;
        auVar47 = vmaxss_avx512f(auVar39,auVar83._0_16_);
        auVar46 = vminss_avx512f(auVar85._0_16_,auVar45);
        bVar10 = true;
        if (auVar47._0_4_ <= auVar46._0_4_) {
          auVar43 = vmaxss_avx512f(auVar39,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
          auVar39 = vminss_avx512f(ZEXT416((uint)(auVar46._0_4_ + 0.1)),auVar45);
          auVar95._0_8_ = auVar101._0_8_;
          auVar95._8_8_ = auVar95._0_8_;
          auVar183._8_8_ = auVar142._0_8_;
          auVar183._0_8_ = auVar142._0_8_;
          auVar192._8_8_ = auVar49._0_8_;
          auVar192._0_8_ = auVar49._0_8_;
          auVar47 = vshufpd_avx(auVar142,auVar142,3);
          auVar46 = vshufpd_avx(auVar49,auVar49,3);
          auVar44 = vshufps_avx(auVar43,auVar39,0);
          auVar40 = vsubps_avx512vl(auVar35,auVar44);
          fVar88 = auVar44._0_4_;
          auVar227._0_4_ = fVar88 * auVar36._0_4_;
          fVar198 = auVar44._4_4_;
          auVar227._4_4_ = fVar198 * auVar36._4_4_;
          fVar199 = auVar44._8_4_;
          auVar227._8_4_ = fVar199 * auVar36._8_4_;
          fVar200 = auVar44._12_4_;
          auVar227._12_4_ = fVar200 * auVar36._12_4_;
          auVar143._0_4_ = fVar88 * auVar47._0_4_;
          auVar143._4_4_ = fVar198 * auVar47._4_4_;
          auVar143._8_4_ = fVar199 * auVar47._8_4_;
          auVar143._12_4_ = fVar200 * auVar47._12_4_;
          auVar147._0_4_ = fVar88 * auVar46._0_4_;
          auVar147._4_4_ = fVar198 * auVar46._4_4_;
          auVar147._8_4_ = fVar199 * auVar46._8_4_;
          auVar147._12_4_ = fVar200 * auVar46._12_4_;
          auVar117._0_4_ = fVar88 * auVar37._0_4_;
          auVar117._4_4_ = fVar198 * auVar37._4_4_;
          auVar117._8_4_ = fVar199 * auVar37._8_4_;
          auVar117._12_4_ = fVar200 * auVar37._12_4_;
          auVar42 = vfmadd231ps_fma(auVar227,auVar40,auVar95);
          auVar38 = vfmadd231ps_fma(auVar143,auVar40,auVar183);
          auVar36 = vfmadd231ps_fma(auVar147,auVar40,auVar192);
          auVar37 = vfmadd231ps_fma(auVar117,auVar40,ZEXT816(0));
          auVar46 = vsubss_avx512f(auVar45,auVar43);
          auVar47 = vmovshdup_avx(auVar236);
          auVar101 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar43._0_4_)),auVar236,auVar46
                                    );
          auVar46 = vsubss_avx512f(auVar45,auVar39);
          auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * auVar47._0_4_)),auVar236,auVar46
                                    );
          auVar39 = vdivss_avx512f(auVar45,ZEXT416((uint)fVar203));
          auVar47 = vsubps_avx(auVar38,auVar42);
          auVar105._0_4_ = auVar47._0_4_ * 3.0;
          auVar105._4_4_ = auVar47._4_4_ * 3.0;
          auVar105._8_4_ = auVar47._8_4_ * 3.0;
          auVar105._12_4_ = auVar47._12_4_ * 3.0;
          auVar47 = vsubps_avx(auVar36,auVar38);
          auVar157._0_4_ = auVar47._0_4_ * 3.0;
          auVar157._4_4_ = auVar47._4_4_ * 3.0;
          auVar157._8_4_ = auVar47._8_4_ * 3.0;
          auVar157._12_4_ = auVar47._12_4_ * 3.0;
          auVar47 = vsubps_avx(auVar37,auVar36);
          auVar172._0_4_ = auVar47._0_4_ * 3.0;
          auVar172._4_4_ = auVar47._4_4_ * 3.0;
          auVar172._8_4_ = auVar47._8_4_ * 3.0;
          auVar172._12_4_ = auVar47._12_4_ * 3.0;
          auVar46 = vminps_avx(auVar157,auVar172);
          auVar47 = vmaxps_avx(auVar157,auVar172);
          auVar46 = vminps_avx(auVar105,auVar46);
          auVar47 = vmaxps_avx(auVar105,auVar47);
          auVar44 = vshufpd_avx(auVar46,auVar46,3);
          auVar43 = vshufpd_avx(auVar47,auVar47,3);
          auVar46 = vminps_avx(auVar46,auVar44);
          auVar47 = vmaxps_avx(auVar47,auVar43);
          fVar203 = auVar39._0_4_;
          auVar173._0_4_ = fVar203 * auVar46._0_4_;
          auVar173._4_4_ = fVar203 * auVar46._4_4_;
          auVar173._8_4_ = fVar203 * auVar46._8_4_;
          auVar173._12_4_ = fVar203 * auVar46._12_4_;
          auVar158._0_4_ = fVar203 * auVar47._0_4_;
          auVar158._4_4_ = fVar203 * auVar47._4_4_;
          auVar158._8_4_ = fVar203 * auVar47._8_4_;
          auVar158._12_4_ = fVar203 * auVar47._12_4_;
          auVar39 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar102._0_4_ - auVar101._0_4_)));
          auVar47 = vshufpd_avx(auVar42,auVar42,3);
          auVar46 = vshufpd_avx(auVar38,auVar38,3);
          auVar44 = vshufpd_avx(auVar36,auVar36,3);
          auVar43 = vshufpd_avx(auVar37,auVar37,3);
          auVar47 = vsubps_avx(auVar47,auVar42);
          auVar42 = vsubps_avx(auVar46,auVar38);
          auVar38 = vsubps_avx(auVar44,auVar36);
          auVar43 = vsubps_avx(auVar43,auVar37);
          auVar46 = vminps_avx(auVar47,auVar42);
          auVar47 = vmaxps_avx(auVar47,auVar42);
          auVar44 = vminps_avx(auVar38,auVar43);
          auVar44 = vminps_avx(auVar46,auVar44);
          auVar46 = vmaxps_avx(auVar38,auVar43);
          auVar47 = vmaxps_avx(auVar47,auVar46);
          fVar203 = auVar39._0_4_;
          auVar193._0_4_ = fVar203 * auVar44._0_4_;
          auVar193._4_4_ = fVar203 * auVar44._4_4_;
          auVar193._8_4_ = fVar203 * auVar44._8_4_;
          auVar193._12_4_ = fVar203 * auVar44._12_4_;
          auVar207._0_4_ = fVar203 * auVar47._0_4_;
          auVar207._4_4_ = fVar203 * auVar47._4_4_;
          auVar207._8_4_ = fVar203 * auVar47._8_4_;
          auVar207._12_4_ = fVar203 * auVar47._12_4_;
          auVar42 = vinsertps_avx(local_2f8,auVar101,0x10);
          auVar38 = vinsertps_avx(auVar48,auVar102,0x10);
          auVar90._0_4_ = auVar42._0_4_ + auVar38._0_4_;
          auVar90._4_4_ = auVar42._4_4_ + auVar38._4_4_;
          auVar90._8_4_ = auVar42._8_4_ + auVar38._8_4_;
          auVar90._12_4_ = auVar42._12_4_ + auVar38._12_4_;
          auVar49 = vmulps_avx512vl(auVar90,auVar248._0_16_);
          auVar44 = vshufps_avx(auVar49,auVar49,0x54);
          uVar89 = auVar49._0_4_;
          auVar106._4_4_ = uVar89;
          auVar106._0_4_ = uVar89;
          auVar106._8_4_ = uVar89;
          auVar106._12_4_ = uVar89;
          auVar36 = vfmadd213ps_avx512vl(auVar243._0_16_,auVar106,auVar246._0_16_);
          auVar46 = vfmadd213ps_fma(auVar245._0_16_,auVar106,local_2d8);
          auVar43 = vfmadd213ps_fma(local_e8,auVar106,local_2e8);
          auVar244 = ZEXT1664(local_2f8);
          auVar47 = vsubps_avx(auVar46,auVar36);
          auVar36 = vfmadd213ps_fma(auVar47,auVar106,auVar36);
          auVar47 = vsubps_avx(auVar43,auVar46);
          auVar47 = vfmadd213ps_fma(auVar47,auVar106,auVar46);
          auVar47 = vsubps_avx(auVar47,auVar36);
          auVar46 = vfmadd231ps_fma(auVar36,auVar47,auVar106);
          auVar107._0_8_ = CONCAT44(auVar47._4_4_ * 3.0,auVar47._0_4_ * 3.0);
          auVar107._8_4_ = auVar47._8_4_ * 3.0;
          auVar107._12_4_ = auVar47._12_4_ * 3.0;
          auVar219._8_8_ = auVar46._0_8_;
          auVar219._0_8_ = auVar46._0_8_;
          auVar47 = vshufpd_avx(auVar46,auVar46,3);
          auVar46 = vshufps_avx(auVar49,auVar49,0x55);
          auVar43 = vsubps_avx(auVar47,auVar219);
          auVar36 = vfmadd231ps_fma(auVar219,auVar46,auVar43);
          auVar233._8_8_ = auVar107._0_8_;
          auVar233._0_8_ = auVar107._0_8_;
          auVar47 = vshufpd_avx(auVar107,auVar107,3);
          auVar47 = vsubps_avx(auVar47,auVar233);
          auVar46 = vfmadd213ps_fma(auVar47,auVar46,auVar233);
          auVar37 = vxorps_avx512vl(auVar43,auVar247._0_16_);
          auVar47 = vmovshdup_avx(auVar46);
          auVar39 = vxorps_avx512vl(auVar47,auVar247._0_16_);
          auVar40 = vmovshdup_avx512vl(auVar43);
          auVar39 = vpermt2ps_avx512vl(auVar39,ZEXT416(5),auVar43);
          auVar47 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar47._0_4_ * auVar43._0_4_)),auVar46,
                                        auVar40);
          auVar46 = vpermt2ps_avx512vl(auVar46,SUB6416(ZEXT464(4),0),auVar37);
          auVar118._0_4_ = auVar47._0_4_;
          auVar118._4_4_ = auVar118._0_4_;
          auVar118._8_4_ = auVar118._0_4_;
          auVar118._12_4_ = auVar118._0_4_;
          auVar47 = vdivps_avx(auVar39,auVar118);
          auVar46 = vdivps_avx(auVar46,auVar118);
          fVar88 = auVar36._0_4_;
          auVar43 = vshufps_avx(auVar36,auVar36,0x55);
          fVar203 = auVar46._0_4_;
          auVar220._0_4_ = fVar88 * auVar47._0_4_ + auVar43._0_4_ * fVar203;
          auVar220._4_4_ = fVar88 * auVar47._4_4_ + auVar43._4_4_ * auVar46._4_4_;
          auVar220._8_4_ = fVar88 * auVar47._8_4_ + auVar43._8_4_ * auVar46._8_4_;
          auVar220._12_4_ = fVar88 * auVar47._12_4_ + auVar43._12_4_ * auVar46._12_4_;
          auVar92 = vsubps_avx(auVar44,auVar220);
          auVar36 = vmovshdup_avx(auVar47);
          auVar44 = vinsertps_avx(auVar173,auVar193,0x1c);
          auVar234._0_4_ = auVar36._0_4_ * auVar44._0_4_;
          auVar234._4_4_ = auVar36._4_4_ * auVar44._4_4_;
          auVar234._8_4_ = auVar36._8_4_ * auVar44._8_4_;
          auVar234._12_4_ = auVar36._12_4_ * auVar44._12_4_;
          auVar43 = vinsertps_avx(auVar158,auVar207,0x1c);
          auVar221._0_4_ = auVar36._0_4_ * auVar43._0_4_;
          auVar221._4_4_ = auVar36._4_4_ * auVar43._4_4_;
          auVar221._8_4_ = auVar36._8_4_ * auVar43._8_4_;
          auVar221._12_4_ = auVar36._12_4_ * auVar43._12_4_;
          auVar41 = vminps_avx512vl(auVar234,auVar221);
          auVar39 = vmaxps_avx(auVar221,auVar234);
          auVar40 = vmovshdup_avx(auVar46);
          auVar36 = vinsertps_avx(auVar193,auVar173,0x4c);
          auVar194._0_4_ = auVar40._0_4_ * auVar36._0_4_;
          auVar194._4_4_ = auVar40._4_4_ * auVar36._4_4_;
          auVar194._8_4_ = auVar40._8_4_ * auVar36._8_4_;
          auVar194._12_4_ = auVar40._12_4_ * auVar36._12_4_;
          auVar37 = vinsertps_avx(auVar207,auVar158,0x4c);
          auVar208._0_4_ = auVar40._0_4_ * auVar37._0_4_;
          auVar208._4_4_ = auVar40._4_4_ * auVar37._4_4_;
          auVar208._8_4_ = auVar40._8_4_ * auVar37._8_4_;
          auVar208._12_4_ = auVar40._12_4_ * auVar37._12_4_;
          auVar40 = vminps_avx(auVar194,auVar208);
          auVar41 = vaddps_avx512vl(auVar41,auVar40);
          auVar40 = vmaxps_avx(auVar208,auVar194);
          auVar195._0_4_ = auVar39._0_4_ + auVar40._0_4_;
          auVar195._4_4_ = auVar39._4_4_ + auVar40._4_4_;
          auVar195._8_4_ = auVar39._8_4_ + auVar40._8_4_;
          auVar195._12_4_ = auVar39._12_4_ + auVar40._12_4_;
          auVar209._8_8_ = 0x3f80000000000000;
          auVar209._0_8_ = 0x3f80000000000000;
          auVar39 = vsubps_avx(auVar209,auVar195);
          auVar40 = vsubps_avx(auVar209,auVar41);
          auVar41 = vsubps_avx(auVar42,auVar49);
          auVar49 = vsubps_avx(auVar38,auVar49);
          fVar201 = auVar41._0_4_;
          auVar235._0_4_ = fVar201 * auVar39._0_4_;
          fVar202 = auVar41._4_4_;
          auVar235._4_4_ = fVar202 * auVar39._4_4_;
          fVar91 = auVar41._8_4_;
          auVar235._8_4_ = fVar91 * auVar39._8_4_;
          fVar113 = auVar41._12_4_;
          auVar235._12_4_ = fVar113 * auVar39._12_4_;
          auVar50 = vbroadcastss_avx512vl(auVar47);
          auVar44 = vmulps_avx512vl(auVar50,auVar44);
          auVar43 = vmulps_avx512vl(auVar50,auVar43);
          auVar50 = vminps_avx512vl(auVar44,auVar43);
          auVar44 = vmaxps_avx(auVar43,auVar44);
          auVar174._0_4_ = fVar203 * auVar36._0_4_;
          auVar174._4_4_ = fVar203 * auVar36._4_4_;
          auVar174._8_4_ = fVar203 * auVar36._8_4_;
          auVar174._12_4_ = fVar203 * auVar36._12_4_;
          auVar159._0_4_ = fVar203 * auVar37._0_4_;
          auVar159._4_4_ = fVar203 * auVar37._4_4_;
          auVar159._8_4_ = fVar203 * auVar37._8_4_;
          auVar159._12_4_ = fVar203 * auVar37._12_4_;
          auVar43 = vminps_avx(auVar174,auVar159);
          auVar36 = vaddps_avx512vl(auVar50,auVar43);
          auVar37 = vmulps_avx512vl(auVar41,auVar40);
          fVar88 = auVar49._0_4_;
          auVar196._0_4_ = fVar88 * auVar39._0_4_;
          fVar198 = auVar49._4_4_;
          auVar196._4_4_ = fVar198 * auVar39._4_4_;
          fVar199 = auVar49._8_4_;
          auVar196._8_4_ = fVar199 * auVar39._8_4_;
          fVar200 = auVar49._12_4_;
          auVar196._12_4_ = fVar200 * auVar39._12_4_;
          auVar210._0_4_ = fVar88 * auVar40._0_4_;
          auVar210._4_4_ = fVar198 * auVar40._4_4_;
          auVar210._8_4_ = fVar199 * auVar40._8_4_;
          auVar210._12_4_ = fVar200 * auVar40._12_4_;
          auVar43 = vmaxps_avx(auVar159,auVar174);
          auVar160._0_4_ = auVar44._0_4_ + auVar43._0_4_;
          auVar160._4_4_ = auVar44._4_4_ + auVar43._4_4_;
          auVar160._8_4_ = auVar44._8_4_ + auVar43._8_4_;
          auVar160._12_4_ = auVar44._12_4_ + auVar43._12_4_;
          auVar175._8_8_ = 0x3f800000;
          auVar175._0_8_ = 0x3f800000;
          auVar44 = vsubps_avx(auVar175,auVar160);
          auVar43 = vsubps_avx(auVar175,auVar36);
          auVar228._0_4_ = fVar201 * auVar44._0_4_;
          auVar228._4_4_ = fVar202 * auVar44._4_4_;
          auVar228._8_4_ = fVar91 * auVar44._8_4_;
          auVar228._12_4_ = fVar113 * auVar44._12_4_;
          auVar222._0_4_ = fVar201 * auVar43._0_4_;
          auVar222._4_4_ = fVar202 * auVar43._4_4_;
          auVar222._8_4_ = fVar91 * auVar43._8_4_;
          auVar222._12_4_ = fVar113 * auVar43._12_4_;
          auVar161._0_4_ = fVar88 * auVar44._0_4_;
          auVar161._4_4_ = fVar198 * auVar44._4_4_;
          auVar161._8_4_ = fVar199 * auVar44._8_4_;
          auVar161._12_4_ = fVar200 * auVar44._12_4_;
          auVar176._0_4_ = fVar88 * auVar43._0_4_;
          auVar176._4_4_ = fVar198 * auVar43._4_4_;
          auVar176._8_4_ = fVar199 * auVar43._8_4_;
          auVar176._12_4_ = fVar200 * auVar43._12_4_;
          auVar44 = vminps_avx(auVar228,auVar222);
          auVar43 = vminps_avx(auVar161,auVar176);
          auVar36 = vminps_avx(auVar44,auVar43);
          auVar44 = vmaxps_avx(auVar222,auVar228);
          auVar43 = vmaxps_avx(auVar176,auVar161);
          auVar43 = vmaxps_avx(auVar43,auVar44);
          auVar39 = vminps_avx512vl(auVar235,auVar37);
          auVar44 = vminps_avx(auVar196,auVar210);
          auVar44 = vminps_avx(auVar39,auVar44);
          auVar44 = vhaddps_avx(auVar36,auVar44);
          auVar39 = vmaxps_avx512vl(auVar37,auVar235);
          auVar36 = vmaxps_avx(auVar210,auVar196);
          auVar36 = vmaxps_avx(auVar36,auVar39);
          auVar43 = vhaddps_avx(auVar43,auVar36);
          auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
          auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
          auVar162._0_4_ = auVar44._0_4_ + auVar92._0_4_;
          auVar162._4_4_ = auVar44._4_4_ + auVar92._4_4_;
          auVar162._8_4_ = auVar44._8_4_ + auVar92._8_4_;
          auVar162._12_4_ = auVar44._12_4_ + auVar92._12_4_;
          auVar177._0_4_ = auVar43._0_4_ + auVar92._0_4_;
          auVar177._4_4_ = auVar43._4_4_ + auVar92._4_4_;
          auVar177._8_4_ = auVar43._8_4_ + auVar92._8_4_;
          auVar177._12_4_ = auVar43._12_4_ + auVar92._12_4_;
          auVar44 = vmaxps_avx(auVar42,auVar162);
          auVar43 = vminps_avx(auVar177,auVar38);
          uVar34 = vcmpps_avx512vl(auVar43,auVar44,1);
          local_298 = vinsertps_avx(auVar101,auVar102,0x10);
          auVar238 = ZEXT1664(local_298);
          if ((uVar34 & 3) == 0) {
            vucomiss_avx512f(local_2f8);
            auVar44 = vxorps_avx512vl(auVar37,auVar37);
            auVar239 = ZEXT1664(auVar44);
            auVar246 = ZEXT1664(local_338);
            if ((uint)uVar27 < 4 && (uVar5 == 0 || lVar31 == 0)) {
              bVar10 = false;
            }
            else {
              lVar31 = 200;
              do {
                auVar43 = vsubss_avx512f(auVar45,auVar92);
                fVar199 = auVar43._0_4_;
                fVar88 = fVar199 * fVar199 * fVar199;
                fVar200 = auVar92._0_4_;
                fVar198 = fVar200 * 3.0 * fVar199 * fVar199;
                fVar199 = fVar199 * fVar200 * fVar200 * 3.0;
                auVar144._4_4_ = fVar88;
                auVar144._0_4_ = fVar88;
                auVar144._8_4_ = fVar88;
                auVar144._12_4_ = fVar88;
                auVar131._4_4_ = fVar198;
                auVar131._0_4_ = fVar198;
                auVar131._8_4_ = fVar198;
                auVar131._12_4_ = fVar198;
                auVar96._4_4_ = fVar199;
                auVar96._0_4_ = fVar199;
                auVar96._8_4_ = fVar199;
                auVar96._12_4_ = fVar199;
                fVar200 = fVar200 * fVar200 * fVar200;
                auVar148._0_4_ = (float)local_1f8._0_4_ * fVar200;
                auVar148._4_4_ = (float)local_1f8._4_4_ * fVar200;
                auVar148._8_4_ = fStack_1f0 * fVar200;
                auVar148._12_4_ = fStack_1ec * fVar200;
                auVar43 = vfmadd231ps_fma(auVar148,local_2e8,auVar96);
                auVar43 = vfmadd231ps_fma(auVar43,local_2d8,auVar131);
                auVar43 = vfmadd231ps_avx512vl(auVar43,local_338,auVar144);
                auVar97._8_8_ = auVar43._0_8_;
                auVar97._0_8_ = auVar43._0_8_;
                auVar43 = vshufpd_avx(auVar43,auVar43,3);
                auVar42 = vshufps_avx(auVar92,auVar92,0x55);
                auVar43 = vsubps_avx(auVar43,auVar97);
                auVar42 = vfmadd213ps_fma(auVar43,auVar42,auVar97);
                fVar88 = auVar42._0_4_;
                auVar43 = vshufps_avx(auVar42,auVar42,0x55);
                auVar98._0_4_ = auVar47._0_4_ * fVar88 + fVar203 * auVar43._0_4_;
                auVar98._4_4_ = auVar47._4_4_ * fVar88 + auVar46._4_4_ * auVar43._4_4_;
                auVar98._8_4_ = auVar47._8_4_ * fVar88 + auVar46._8_4_ * auVar43._8_4_;
                auVar98._12_4_ = auVar47._12_4_ * fVar88 + auVar46._12_4_ * auVar43._12_4_;
                auVar92 = vsubps_avx(auVar92,auVar98);
                auVar43 = vandps_avx512vl(auVar42,auVar240._0_16_);
                auVar42 = vprolq_avx512vl(auVar43,0x20);
                auVar43 = vmaxss_avx(auVar42,auVar43);
                bVar11 = auVar43._0_4_ <= (float)local_208._0_4_;
                if (auVar43._0_4_ < (float)local_208._0_4_) {
                  auVar47 = vucomiss_avx512f(auVar44);
                  if (bVar11) {
                    auVar46 = vucomiss_avx512f(auVar47);
                    auVar241 = ZEXT1664(auVar46);
                    if (bVar11) {
                      vmovshdup_avx(auVar47);
                      auVar46 = vucomiss_avx512f(auVar44);
                      if (bVar11) {
                        auVar45 = vucomiss_avx512f(auVar46);
                        auVar241 = ZEXT1664(auVar45);
                        if (bVar11) {
                          auVar43 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2])
                                                  ,ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]
                                                          ),0x1c);
                          auVar41 = vinsertps_avx(auVar43,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                          aVar1 = (ray->super_RayK<1>).org.field_0;
                          auVar43 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                          auVar43 = vdpps_avx(auVar43,auVar41,0x7f);
                          auVar42 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                          auVar42 = vdpps_avx(auVar42,auVar41,0x7f);
                          auVar38 = vsubps_avx(local_268,(undefined1  [16])aVar1);
                          auVar38 = vdpps_avx(auVar38,auVar41,0x7f);
                          auVar36 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                          auVar36 = vdpps_avx(auVar36,auVar41,0x7f);
                          auVar37 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
                          auVar37 = vdpps_avx(auVar37,auVar41,0x7f);
                          auVar39 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                          auVar39 = vdpps_avx(auVar39,auVar41,0x7f);
                          auVar40 = vsubps_avx(_local_288,(undefined1  [16])aVar1);
                          auVar40 = vdpps_avx(auVar40,auVar41,0x7f);
                          auVar49 = vsubps_avx(_local_248,(undefined1  [16])aVar1);
                          auVar41 = vdpps_avx(auVar49,auVar41,0x7f);
                          auVar49 = vsubss_avx512f(auVar45,auVar46);
                          fVar203 = auVar46._0_4_;
                          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ * fVar203)),auVar49
                                                    ,auVar43);
                          auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar203)),auVar49
                                                    ,auVar42);
                          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar203)),auVar49
                                                    ,auVar38);
                          auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar41._0_4_)),auVar49
                                                    ,auVar36);
                          auVar45 = vsubss_avx512f(auVar45,auVar47);
                          auVar149._0_4_ = auVar45._0_4_;
                          fVar203 = auVar149._0_4_ * auVar149._0_4_ * auVar149._0_4_;
                          fVar199 = auVar47._0_4_;
                          fVar88 = fVar199 * 3.0 * auVar149._0_4_ * auVar149._0_4_;
                          fVar198 = auVar149._0_4_ * fVar199 * fVar199 * 3.0;
                          fVar201 = fVar199 * fVar199 * fVar199;
                          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar38._0_4_)),
                                                    ZEXT416((uint)fVar198),auVar42);
                          auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar88),auVar43);
                          auVar46 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar203),auVar46);
                          fVar200 = auVar46._0_4_;
                          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar200) &&
                             (fVar202 = (ray->super_RayK<1>).tfar, fVar200 <= fVar202)) {
                            auVar46 = vshufps_avx(auVar47,auVar47,0x55);
                            auVar43 = vsubps_avx512vl(auVar35,auVar46);
                            fVar91 = auVar46._0_4_;
                            auVar184._0_4_ = fVar91 * (float)local_228._0_4_;
                            fVar113 = auVar46._4_4_;
                            auVar184._4_4_ = fVar113 * (float)local_228._4_4_;
                            fVar123 = auVar46._8_4_;
                            auVar184._8_4_ = fVar123 * fStack_220;
                            fVar124 = auVar46._12_4_;
                            auVar184._12_4_ = fVar124 * fStack_21c;
                            auVar197._0_4_ = fVar91 * (float)local_278._0_4_;
                            auVar197._4_4_ = fVar113 * (float)local_278._4_4_;
                            auVar197._8_4_ = fVar123 * fStack_270;
                            auVar197._12_4_ = fVar124 * fStack_26c;
                            auVar211._0_4_ = fVar91 * (float)local_288._0_4_;
                            auVar211._4_4_ = fVar113 * (float)local_288._4_4_;
                            auVar211._8_4_ = fVar123 * fStack_280;
                            auVar211._12_4_ = fVar124 * fStack_27c;
                            auVar163._0_4_ = fVar91 * (float)local_248._0_4_;
                            auVar163._4_4_ = fVar113 * (float)local_248._4_4_;
                            auVar163._8_4_ = fVar123 * fStack_240;
                            auVar163._12_4_ = fVar124 * fStack_23c;
                            auVar35 = vfmadd231ps_fma(auVar184,auVar43,local_218);
                            auVar46 = vfmadd231ps_fma(auVar197,auVar43,local_258);
                            auVar45 = vfmadd231ps_fma(auVar211,auVar43,local_268);
                            auVar43 = vfmadd231ps_fma(auVar163,auVar43,local_238);
                            auVar35 = vsubps_avx(auVar46,auVar35);
                            auVar46 = vsubps_avx(auVar45,auVar46);
                            auVar45 = vsubps_avx(auVar43,auVar45);
                            auVar212._0_4_ = fVar199 * auVar46._0_4_;
                            auVar212._4_4_ = fVar199 * auVar46._4_4_;
                            auVar212._8_4_ = fVar199 * auVar46._8_4_;
                            auVar212._12_4_ = fVar199 * auVar46._12_4_;
                            auVar149._4_4_ = auVar149._0_4_;
                            auVar149._8_4_ = auVar149._0_4_;
                            auVar149._12_4_ = auVar149._0_4_;
                            auVar35 = vfmadd231ps_fma(auVar212,auVar149,auVar35);
                            auVar164._0_4_ = fVar199 * auVar45._0_4_;
                            auVar164._4_4_ = fVar199 * auVar45._4_4_;
                            auVar164._8_4_ = fVar199 * auVar45._8_4_;
                            auVar164._12_4_ = fVar199 * auVar45._12_4_;
                            auVar46 = vfmadd231ps_fma(auVar164,auVar149,auVar46);
                            auVar165._0_4_ = fVar199 * auVar46._0_4_;
                            auVar165._4_4_ = fVar199 * auVar46._4_4_;
                            auVar165._8_4_ = fVar199 * auVar46._8_4_;
                            auVar165._12_4_ = fVar199 * auVar46._12_4_;
                            auVar35 = vfmadd231ps_fma(auVar165,auVar149,auVar35);
                            auVar14._8_4_ = 0x40400000;
                            auVar14._0_8_ = 0x4040000040400000;
                            auVar14._12_4_ = 0x40400000;
                            auVar35 = vmulps_avx512vl(auVar35,auVar14);
                            pGVar6 = (context->scene->geometries).items[uVar32].ptr;
                            if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                              auVar145._0_4_ = fVar201 * (float)local_128._0_4_;
                              auVar145._4_4_ = fVar201 * (float)local_128._4_4_;
                              auVar145._8_4_ = fVar201 * fStack_120;
                              auVar145._12_4_ = fVar201 * fStack_11c;
                              auVar132._4_4_ = fVar198;
                              auVar132._0_4_ = fVar198;
                              auVar132._8_4_ = fVar198;
                              auVar132._12_4_ = fVar198;
                              auVar46 = vfmadd132ps_fma(auVar132,auVar145,local_118);
                              auVar119._4_4_ = fVar88;
                              auVar119._0_4_ = fVar88;
                              auVar119._8_4_ = fVar88;
                              auVar119._12_4_ = fVar88;
                              auVar46 = vfmadd132ps_fma(auVar119,auVar46,local_108);
                              auVar108._4_4_ = fVar203;
                              auVar108._0_4_ = fVar203;
                              auVar108._8_4_ = fVar203;
                              auVar108._12_4_ = fVar203;
                              auVar43 = vfmadd132ps_fma(auVar108,auVar46,local_f8);
                              auVar46 = vshufps_avx(auVar43,auVar43,0xc9);
                              auVar45 = vshufps_avx(auVar35,auVar35,0xc9);
                              auVar109._0_4_ = auVar43._0_4_ * auVar45._0_4_;
                              auVar109._4_4_ = auVar43._4_4_ * auVar45._4_4_;
                              auVar109._8_4_ = auVar43._8_4_ * auVar45._8_4_;
                              auVar109._12_4_ = auVar43._12_4_ * auVar45._12_4_;
                              auVar35 = vfmsub231ps_fma(auVar109,auVar35,auVar46);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                (ray->super_RayK<1>).tfar = fVar200;
                                auVar46 = vshufps_avx(auVar35,auVar35,0xe9);
                                uVar12 = vmovlps_avx(auVar46);
                                *(undefined8 *)&(ray->Ng).field_0 = uVar12;
                                (ray->Ng).field_0.field_0.z = auVar35._0_4_;
                                uVar12 = vmovlps_avx(auVar47);
                                ray->u = (float)(int)uVar12;
                                ray->v = (float)(int)((ulong)uVar12 >> 0x20);
                                ray->primID = (uint)local_320;
                                ray->geomID = uVar32;
                                ray->instID[0] = context->user->instID[0];
                                ray->instPrimID[0] = context->user->instPrimID[0];
                              }
                              else {
                                auVar46 = vshufps_avx(auVar35,auVar35,0xe9);
                                local_158 = vmovlps_avx(auVar46);
                                local_150 = auVar35._0_4_;
                                local_14c = vmovlps_avx(auVar47);
                                local_144 = (uint)local_320;
                                local_140 = uVar32;
                                local_13c = context->user->instID[0];
                                local_138 = context->user->instPrimID[0];
                                (ray->super_RayK<1>).tfar = fVar200;
                                local_33c = -1;
                                local_2c8.valid = &local_33c;
                                local_2c8.geometryUserPtr = pGVar6->userPtr;
                                local_2c8.context = context->user;
                                local_2c8.ray = (RTCRayN *)ray;
                                local_2c8.hit = (RTCHitN *)&local_158;
                                local_2c8.N = 1;
                                if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01dcdc49:
                                  auVar35 = auVar239._0_16_;
                                  p_Var7 = context->args->filter;
                                  if (p_Var7 != (RTCFilterFunctionN)0x0) {
                                    if (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                       (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                      (*p_Var7)(&local_2c8);
                                      auVar238 = ZEXT1664(local_298);
                                      auVar245 = ZEXT1664(local_318);
                                      auVar243 = ZEXT1664(local_308);
                                      auVar246 = ZEXT1664(local_338);
                                      auVar35 = vxorps_avx512vl(auVar35,auVar35);
                                      auVar239 = ZEXT1664(auVar35);
                                      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar242 = ZEXT1664(auVar35);
                                      auVar241 = ZEXT464(0x3f800000);
                                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      in_ZMM18 = ZEXT3264(auVar56);
                                      auVar69._16_16_ = auVar56._16_16_;
                                      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar240 = ZEXT1664(auVar35);
                                      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                      auVar248 = ZEXT1664(auVar35);
                                      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar247 = ZEXT1664(auVar35);
                                    }
                                    if (*local_2c8.valid == 0) goto LAB_01dcdd9a;
                                  }
                                  (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).components[0] =
                                       *(float *)local_2c8.hit;
                                  (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.y =
                                       *(float *)(local_2c8.hit + 4);
                                  (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.z =
                                       *(float *)(local_2c8.hit + 8);
                                  *(float *)((long)local_2c8.ray + 0x3c) =
                                       *(float *)(local_2c8.hit + 0xc);
                                  *(float *)((long)local_2c8.ray + 0x40) =
                                       *(float *)(local_2c8.hit + 0x10);
                                  *(float *)((long)local_2c8.ray + 0x44) =
                                       *(float *)(local_2c8.hit + 0x14);
                                  *(float *)((long)local_2c8.ray + 0x48) =
                                       *(float *)(local_2c8.hit + 0x18);
                                  *(float *)((long)local_2c8.ray + 0x4c) =
                                       *(float *)(local_2c8.hit + 0x1c);
                                  *(float *)((long)local_2c8.ray + 0x50) =
                                       *(float *)(local_2c8.hit + 0x20);
                                }
                                else {
                                  (*pGVar6->intersectionFilterN)(&local_2c8);
                                  auVar238 = ZEXT1664(local_298);
                                  auVar245 = ZEXT1664(local_318);
                                  auVar243 = ZEXT1664(local_308);
                                  auVar246 = ZEXT1664(local_338);
                                  auVar35 = vxorps_avx512vl(auVar44,auVar44);
                                  auVar239 = ZEXT1664(auVar35);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar242 = ZEXT1664(auVar35);
                                  auVar241 = ZEXT464(0x3f800000);
                                  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM18 = ZEXT3264(auVar56);
                                  auVar69._16_16_ = auVar56._16_16_;
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar240 = ZEXT1664(auVar35);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar248 = ZEXT1664(auVar35);
                                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar247 = ZEXT1664(auVar35);
                                  if (*local_2c8.valid != 0) goto LAB_01dcdc49;
LAB_01dcdd9a:
                                  (ray->super_RayK<1>).tfar = fVar202;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar31 = lVar31 + -1;
              } while (lVar31 != 0);
            }
          }
          else {
            auVar35 = vxorps_avx512vl(auVar37,auVar37);
            auVar239 = ZEXT1664(auVar35);
            auVar246 = ZEXT1664(local_338);
          }
        }
      }
    } while (bVar10);
    auVar35 = vinsertps_avx(local_2f8,auVar48,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }